

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  undefined4 uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [12];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  byte bVar73;
  byte bVar74;
  byte bVar75;
  ulong uVar76;
  byte bVar77;
  ulong uVar78;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  uint uVar79;
  long lVar80;
  bool bVar81;
  ulong uVar82;
  uint uVar83;
  uint uVar136;
  uint uVar137;
  uint uVar139;
  uint uVar140;
  uint uVar141;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  uint uVar138;
  uint uVar142;
  undefined1 auVar129 [32];
  undefined1 auVar90 [16];
  undefined1 auVar130 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar135 [32];
  float pp;
  float fVar143;
  float fVar144;
  undefined4 uVar145;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar187;
  float fVar188;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar204;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar202;
  float fVar203;
  undefined1 auVar201 [64];
  float fVar205;
  float fVar206;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar225;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar226 [64];
  float fVar230;
  float fVar231;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar232;
  undefined1 auVar229 [32];
  float fVar233;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [16];
  undefined1 auVar237 [64];
  float fVar239;
  float fVar240;
  float fVar241;
  undefined1 auVar238 [64];
  float fVar242;
  undefined1 auVar243 [16];
  undefined1 auVar244 [64];
  undefined1 auVar245 [16];
  float fVar247;
  undefined1 auVar246 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [64];
  undefined1 auVar252 [32];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined8 local_900;
  undefined8 uStack_8f8;
  ulong local_8f0;
  uint local_8e4;
  uint local_8e0;
  undefined4 local_8dc;
  float local_8d8;
  float local_8d4;
  RTCFilterFunctionNArguments local_8d0;
  undefined1 local_8a0 [32];
  undefined1 local_870 [16];
  Primitive *local_860;
  ulong local_858;
  ulong local_850;
  ulong local_848;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  float local_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  float local_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  RTCHitN local_600 [16];
  undefined1 auStack_5f0 [16];
  undefined4 local_5e0;
  undefined4 uStack_5dc;
  undefined4 uStack_5d8;
  undefined4 uStack_5d4;
  float local_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [16];
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [16];
  uint local_590;
  uint uStack_58c;
  uint uStack_588;
  uint uStack_584;
  uint uStack_580;
  uint uStack_57c;
  uint uStack_578;
  uint uStack_574;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  undefined4 uStack_35c;
  undefined4 uStack_358;
  undefined4 uStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  float afStack_140 [2];
  uint auStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar123 [32];
  undefined1 auVar131 [32];
  undefined1 auVar134 [32];
  
  PVar7 = prim[1];
  uVar76 = (ulong)(byte)PVar7;
  fVar206 = *(float *)(prim + uVar76 * 0x19 + 0x12);
  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar243 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar89 = vinsertps_avx(auVar243,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar90 = vsubps_avx(auVar86,*(undefined1 (*) [16])(prim + uVar76 * 0x19 + 6));
  fVar205 = fVar206 * auVar90._0_4_;
  fVar143 = fVar206 * auVar89._0_4_;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar76 * 4 + 6);
  auVar96 = vpmovsxbd_avx2(auVar86);
  auVar243._8_8_ = 0;
  auVar243._0_8_ = *(ulong *)(prim + uVar76 * 5 + 6);
  auVar94 = vpmovsxbd_avx2(auVar243);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar76 * 6 + 6);
  auVar97 = vpmovsxbd_avx2(auVar87);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar76 * 0xb + 6);
  auVar98 = vpmovsxbd_avx2(auVar5);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6);
  auVar103 = vpmovsxbd_avx2(auVar84);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar99 = vcvtdq2ps_avx(auVar103);
  auVar215._8_8_ = 0;
  auVar215._0_8_ = *(ulong *)(prim + (uint)(byte)PVar7 * 0xc + uVar76 + 6);
  auVar95 = vpmovsxbd_avx2(auVar215);
  auVar95 = vcvtdq2ps_avx(auVar95);
  uVar82 = (ulong)(uint)((int)(uVar76 * 9) * 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar82 + 6);
  auVar100 = vpmovsxbd_avx2(auVar6);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar82 + uVar76 + 6);
  auVar101 = vpmovsxbd_avx2(auVar85);
  auVar101 = vcvtdq2ps_avx(auVar101);
  uVar78 = (ulong)(uint)((int)(uVar76 * 5) << 2);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar78 + 6);
  auVar93 = vpmovsxbd_avx2(auVar88);
  auVar102 = vcvtdq2ps_avx(auVar93);
  auVar249 = ZEXT3264(auVar102);
  auVar113._4_4_ = fVar143;
  auVar113._0_4_ = fVar143;
  auVar113._8_4_ = fVar143;
  auVar113._12_4_ = fVar143;
  auVar113._16_4_ = fVar143;
  auVar113._20_4_ = fVar143;
  auVar113._24_4_ = fVar143;
  auVar113._28_4_ = fVar143;
  auVar199._8_4_ = 1;
  auVar199._0_8_ = 0x100000001;
  auVar199._12_4_ = 1;
  auVar199._16_4_ = 1;
  auVar199._20_4_ = 1;
  auVar199._24_4_ = 1;
  auVar199._28_4_ = 1;
  auVar91 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar105 = ZEXT1632(CONCAT412(fVar206 * auVar89._12_4_,
                                CONCAT48(fVar206 * auVar89._8_4_,
                                         CONCAT44(fVar206 * auVar89._4_4_,fVar143))));
  auVar104 = vpermps_avx2(auVar199,auVar105);
  auVar92 = vpermps_avx512vl(auVar91,auVar105);
  fVar143 = auVar92._0_4_;
  fVar230 = auVar92._4_4_;
  auVar105._4_4_ = fVar230 * auVar97._4_4_;
  auVar105._0_4_ = fVar143 * auVar97._0_4_;
  fVar231 = auVar92._8_4_;
  auVar105._8_4_ = fVar231 * auVar97._8_4_;
  fVar232 = auVar92._12_4_;
  auVar105._12_4_ = fVar232 * auVar97._12_4_;
  fVar239 = auVar92._16_4_;
  auVar105._16_4_ = fVar239 * auVar97._16_4_;
  fVar240 = auVar92._20_4_;
  auVar105._20_4_ = fVar240 * auVar97._20_4_;
  fVar241 = auVar92._24_4_;
  auVar105._24_4_ = fVar241 * auVar97._24_4_;
  auVar105._28_4_ = auVar103._28_4_;
  auVar103._4_4_ = auVar95._4_4_ * fVar230;
  auVar103._0_4_ = auVar95._0_4_ * fVar143;
  auVar103._8_4_ = auVar95._8_4_ * fVar231;
  auVar103._12_4_ = auVar95._12_4_ * fVar232;
  auVar103._16_4_ = auVar95._16_4_ * fVar239;
  auVar103._20_4_ = auVar95._20_4_ * fVar240;
  auVar103._24_4_ = auVar95._24_4_ * fVar241;
  auVar103._28_4_ = auVar93._28_4_;
  auVar93._4_4_ = auVar102._4_4_ * fVar230;
  auVar93._0_4_ = auVar102._0_4_ * fVar143;
  auVar93._8_4_ = auVar102._8_4_ * fVar231;
  auVar93._12_4_ = auVar102._12_4_ * fVar232;
  auVar93._16_4_ = auVar102._16_4_ * fVar239;
  auVar93._20_4_ = auVar102._20_4_ * fVar240;
  auVar93._24_4_ = auVar102._24_4_ * fVar241;
  auVar93._28_4_ = auVar92._28_4_;
  auVar86 = vfmadd231ps_fma(auVar105,auVar104,auVar94);
  auVar243 = vfmadd231ps_fma(auVar103,auVar104,auVar99);
  auVar87 = vfmadd231ps_fma(auVar93,auVar101,auVar104);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar113,auVar96);
  auVar243 = vfmadd231ps_fma(ZEXT1632(auVar243),auVar113,auVar98);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar100,auVar113);
  auVar114._4_4_ = fVar205;
  auVar114._0_4_ = fVar205;
  auVar114._8_4_ = fVar205;
  auVar114._12_4_ = fVar205;
  auVar114._16_4_ = fVar205;
  auVar114._20_4_ = fVar205;
  auVar114._24_4_ = fVar205;
  auVar114._28_4_ = fVar205;
  auVar253 = ZEXT3264(auVar114);
  auVar93 = ZEXT1632(CONCAT412(fVar206 * auVar90._12_4_,
                               CONCAT48(fVar206 * auVar90._8_4_,
                                        CONCAT44(fVar206 * auVar90._4_4_,fVar205))));
  auVar103 = vpermps_avx2(auVar199,auVar93);
  auVar93 = vpermps_avx512vl(auVar91,auVar93);
  fVar206 = auVar93._0_4_;
  fVar143 = auVar93._4_4_;
  auVar104._4_4_ = fVar143 * auVar97._4_4_;
  auVar104._0_4_ = fVar206 * auVar97._0_4_;
  fVar230 = auVar93._8_4_;
  auVar104._8_4_ = fVar230 * auVar97._8_4_;
  fVar231 = auVar93._12_4_;
  auVar104._12_4_ = fVar231 * auVar97._12_4_;
  fVar232 = auVar93._16_4_;
  auVar104._16_4_ = fVar232 * auVar97._16_4_;
  fVar239 = auVar93._20_4_;
  auVar104._20_4_ = fVar239 * auVar97._20_4_;
  fVar240 = auVar93._24_4_;
  auVar104._24_4_ = fVar240 * auVar97._24_4_;
  auVar104._28_4_ = 1;
  auVar91._4_4_ = auVar95._4_4_ * fVar143;
  auVar91._0_4_ = auVar95._0_4_ * fVar206;
  auVar91._8_4_ = auVar95._8_4_ * fVar230;
  auVar91._12_4_ = auVar95._12_4_ * fVar231;
  auVar91._16_4_ = auVar95._16_4_ * fVar232;
  auVar91._20_4_ = auVar95._20_4_ * fVar239;
  auVar91._24_4_ = auVar95._24_4_ * fVar240;
  auVar91._28_4_ = auVar97._28_4_;
  auVar95._4_4_ = auVar102._4_4_ * fVar143;
  auVar95._0_4_ = auVar102._0_4_ * fVar206;
  auVar95._8_4_ = auVar102._8_4_ * fVar230;
  auVar95._12_4_ = auVar102._12_4_ * fVar231;
  auVar95._16_4_ = auVar102._16_4_ * fVar232;
  auVar95._20_4_ = auVar102._20_4_ * fVar239;
  auVar95._24_4_ = auVar102._24_4_ * fVar240;
  auVar95._28_4_ = auVar93._28_4_;
  auVar5 = vfmadd231ps_fma(auVar104,auVar103,auVar94);
  auVar84 = vfmadd231ps_fma(auVar91,auVar103,auVar99);
  auVar215 = vfmadd231ps_fma(auVar95,auVar103,auVar101);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar114,auVar96);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar114,auVar98);
  auVar110._8_4_ = 0x7fffffff;
  auVar110._0_8_ = 0x7fffffff7fffffff;
  auVar110._12_4_ = 0x7fffffff;
  auVar110._16_4_ = 0x7fffffff;
  auVar110._20_4_ = 0x7fffffff;
  auVar110._24_4_ = 0x7fffffff;
  auVar110._28_4_ = 0x7fffffff;
  auVar215 = vfmadd231ps_fma(ZEXT1632(auVar215),auVar114,auVar100);
  auVar96 = vandps_avx(ZEXT1632(auVar86),auVar110);
  auVar112._8_4_ = 0x219392ef;
  auVar112._0_8_ = 0x219392ef219392ef;
  auVar112._12_4_ = 0x219392ef;
  auVar112._16_4_ = 0x219392ef;
  auVar112._20_4_ = 0x219392ef;
  auVar112._24_4_ = 0x219392ef;
  auVar112._28_4_ = 0x219392ef;
  uVar82 = vcmpps_avx512vl(auVar96,auVar112,1);
  bVar11 = (bool)((byte)uVar82 & 1);
  auVar92._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar86._0_4_;
  bVar11 = (bool)((byte)(uVar82 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar86._4_4_;
  bVar11 = (bool)((byte)(uVar82 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar86._8_4_;
  bVar11 = (bool)((byte)(uVar82 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar86._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar82 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar82 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar82 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar82 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar243),auVar110);
  uVar82 = vcmpps_avx512vl(auVar96,auVar112,1);
  bVar11 = (bool)((byte)uVar82 & 1);
  auVar106._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar243._0_4_;
  bVar11 = (bool)((byte)(uVar82 >> 1) & 1);
  auVar106._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar243._4_4_;
  bVar11 = (bool)((byte)(uVar82 >> 2) & 1);
  auVar106._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar243._8_4_;
  bVar11 = (bool)((byte)(uVar82 >> 3) & 1);
  auVar106._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar243._12_4_;
  auVar106._16_4_ = (uint)((byte)(uVar82 >> 4) & 1) * 0x219392ef;
  auVar106._20_4_ = (uint)((byte)(uVar82 >> 5) & 1) * 0x219392ef;
  auVar106._24_4_ = (uint)((byte)(uVar82 >> 6) & 1) * 0x219392ef;
  auVar106._28_4_ = (uint)(byte)(uVar82 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar87),auVar110);
  uVar82 = vcmpps_avx512vl(auVar96,auVar112,1);
  bVar11 = (bool)((byte)uVar82 & 1);
  auVar96._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar87._0_4_;
  bVar11 = (bool)((byte)(uVar82 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar87._4_4_;
  bVar11 = (bool)((byte)(uVar82 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar87._8_4_;
  bVar11 = (bool)((byte)(uVar82 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar87._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar82 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar82 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar82 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar82 >> 7) * 0x219392ef;
  auVar94 = vrcp14ps_avx512vl(auVar92);
  auVar111._8_4_ = 0x3f800000;
  auVar111._0_8_ = &DAT_3f8000003f800000;
  auVar111._12_4_ = 0x3f800000;
  auVar111._16_4_ = 0x3f800000;
  auVar111._20_4_ = 0x3f800000;
  auVar111._24_4_ = 0x3f800000;
  auVar111._28_4_ = 0x3f800000;
  auVar86 = vfnmadd213ps_fma(auVar92,auVar94,auVar111);
  auVar86 = vfmadd132ps_fma(ZEXT1632(auVar86),auVar94,auVar94);
  auVar94 = vrcp14ps_avx512vl(auVar106);
  auVar243 = vfnmadd213ps_fma(auVar106,auVar94,auVar111);
  auVar243 = vfmadd132ps_fma(ZEXT1632(auVar243),auVar94,auVar94);
  auVar94 = vrcp14ps_avx512vl(auVar96);
  auVar87 = vfnmadd213ps_fma(auVar96,auVar94,auVar111);
  auVar87 = vfmadd132ps_fma(ZEXT1632(auVar87),auVar94,auVar94);
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 7 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar5));
  auVar100._4_4_ = auVar86._4_4_ * auVar96._4_4_;
  auVar100._0_4_ = auVar86._0_4_ * auVar96._0_4_;
  auVar100._8_4_ = auVar86._8_4_ * auVar96._8_4_;
  auVar100._12_4_ = auVar86._12_4_ * auVar96._12_4_;
  auVar100._16_4_ = auVar96._16_4_ * 0.0;
  auVar100._20_4_ = auVar96._20_4_ * 0.0;
  auVar100._24_4_ = auVar96._24_4_ * 0.0;
  auVar100._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 9 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar5));
  auVar95 = vpbroadcastd_avx512vl();
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar7 * 0x10 + 6));
  auVar109._0_4_ = auVar86._0_4_ * auVar96._0_4_;
  auVar109._4_4_ = auVar86._4_4_ * auVar96._4_4_;
  auVar109._8_4_ = auVar86._8_4_ * auVar96._8_4_;
  auVar109._12_4_ = auVar86._12_4_ * auVar96._12_4_;
  auVar109._16_4_ = auVar96._16_4_ * 0.0;
  auVar109._20_4_ = auVar96._20_4_ * 0.0;
  auVar109._24_4_ = auVar96._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar7 * 0x10 + uVar76 * -2 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar84));
  auVar101._4_4_ = auVar243._4_4_ * auVar96._4_4_;
  auVar101._0_4_ = auVar243._0_4_ * auVar96._0_4_;
  auVar101._8_4_ = auVar243._8_4_ * auVar96._8_4_;
  auVar101._12_4_ = auVar243._12_4_ * auVar96._12_4_;
  auVar101._16_4_ = auVar96._16_4_ * 0.0;
  auVar101._20_4_ = auVar96._20_4_ * 0.0;
  auVar101._24_4_ = auVar96._24_4_ * 0.0;
  auVar101._28_4_ = auVar96._28_4_;
  auVar96 = vcvtdq2ps_avx(auVar94);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar84));
  auVar108._0_4_ = auVar243._0_4_ * auVar96._0_4_;
  auVar108._4_4_ = auVar243._4_4_ * auVar96._4_4_;
  auVar108._8_4_ = auVar243._8_4_ * auVar96._8_4_;
  auVar108._12_4_ = auVar243._12_4_ * auVar96._12_4_;
  auVar108._16_4_ = auVar96._16_4_ * 0.0;
  auVar108._20_4_ = auVar96._20_4_ * 0.0;
  auVar108._24_4_ = auVar96._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 + uVar76 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar215));
  auVar102._4_4_ = auVar96._4_4_ * auVar87._4_4_;
  auVar102._0_4_ = auVar96._0_4_ * auVar87._0_4_;
  auVar102._8_4_ = auVar96._8_4_ * auVar87._8_4_;
  auVar102._12_4_ = auVar96._12_4_ * auVar87._12_4_;
  auVar102._16_4_ = auVar96._16_4_ * 0.0;
  auVar102._20_4_ = auVar96._20_4_ * 0.0;
  auVar102._24_4_ = auVar96._24_4_ * 0.0;
  auVar102._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x17 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar215));
  auVar107._0_4_ = auVar87._0_4_ * auVar96._0_4_;
  auVar107._4_4_ = auVar87._4_4_ * auVar96._4_4_;
  auVar107._8_4_ = auVar87._8_4_ * auVar96._8_4_;
  auVar107._12_4_ = auVar87._12_4_ * auVar96._12_4_;
  auVar107._16_4_ = auVar96._16_4_ * 0.0;
  auVar107._20_4_ = auVar96._20_4_ * 0.0;
  auVar107._24_4_ = auVar96._24_4_ * 0.0;
  auVar107._28_4_ = 0;
  auVar96 = vpminsd_avx2(auVar100,auVar109);
  auVar94 = vpminsd_avx2(auVar101,auVar108);
  auVar96 = vmaxps_avx(auVar96,auVar94);
  auVar94 = vpminsd_avx2(auVar102,auVar107);
  uVar145 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar97._4_4_ = uVar145;
  auVar97._0_4_ = uVar145;
  auVar97._8_4_ = uVar145;
  auVar97._12_4_ = uVar145;
  auVar97._16_4_ = uVar145;
  auVar97._20_4_ = uVar145;
  auVar97._24_4_ = uVar145;
  auVar97._28_4_ = uVar145;
  auVar94 = vmaxps_avx512vl(auVar94,auVar97);
  auVar96 = vmaxps_avx(auVar96,auVar94);
  auVar94._8_4_ = 0x3f7ffffa;
  auVar94._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar94._12_4_ = 0x3f7ffffa;
  auVar94._16_4_ = 0x3f7ffffa;
  auVar94._20_4_ = 0x3f7ffffa;
  auVar94._24_4_ = 0x3f7ffffa;
  auVar94._28_4_ = 0x3f7ffffa;
  local_420 = vmulps_avx512vl(auVar96,auVar94);
  auVar96 = vpmaxsd_avx2(auVar100,auVar109);
  auVar94 = vpmaxsd_avx2(auVar101,auVar108);
  auVar96 = vminps_avx(auVar96,auVar94);
  auVar94 = vpmaxsd_avx2(auVar102,auVar107);
  uVar145 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar98._4_4_ = uVar145;
  auVar98._0_4_ = uVar145;
  auVar98._8_4_ = uVar145;
  auVar98._12_4_ = uVar145;
  auVar98._16_4_ = uVar145;
  auVar98._20_4_ = uVar145;
  auVar98._24_4_ = uVar145;
  auVar98._28_4_ = uVar145;
  auVar94 = vminps_avx512vl(auVar94,auVar98);
  auVar96 = vminps_avx(auVar96,auVar94);
  auVar99._8_4_ = 0x3f800003;
  auVar99._0_8_ = 0x3f8000033f800003;
  auVar99._12_4_ = 0x3f800003;
  auVar99._16_4_ = 0x3f800003;
  auVar99._20_4_ = 0x3f800003;
  auVar99._24_4_ = 0x3f800003;
  auVar99._28_4_ = 0x3f800003;
  auVar96 = vmulps_avx512vl(auVar96,auVar99);
  uVar19 = vpcmpgtd_avx512vl(auVar95,_DAT_0205a920);
  uVar18 = vcmpps_avx512vl(local_420,auVar96,2);
  if ((byte)((byte)uVar18 & (byte)uVar19) == 0) {
    return;
  }
  local_848 = (ulong)(byte)((byte)uVar18 & (byte)uVar19);
  local_630 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_860 = prim;
LAB_01e080f7:
  lVar80 = 0;
  for (uVar82 = local_848; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
    lVar80 = lVar80 + 1;
  }
  uVar79 = *(uint *)(prim + 2);
  local_8f0 = (ulong)*(uint *)(prim + lVar80 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[uVar79].ptr;
  uVar82 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_8f0);
  p_Var10 = pGVar9[1].intersectionFilterN;
  lVar80 = *(long *)&pGVar9[1].time_range.upper;
  auVar86 = *(undefined1 (*) [16])(lVar80 + (long)p_Var10 * uVar82);
  auVar243 = *(undefined1 (*) [16])(lVar80 + (uVar82 + 1) * (long)p_Var10);
  auVar87 = *(undefined1 (*) [16])(lVar80 + (uVar82 + 2) * (long)p_Var10);
  local_848 = local_848 - 1 & local_848;
  auVar5 = *(undefined1 (*) [16])(lVar80 + (uVar82 + 3) * (long)p_Var10);
  if (local_848 != 0) {
    uVar78 = local_848 - 1 & local_848;
    for (uVar82 = local_848; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
    }
    if (uVar78 != 0) {
      for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar215 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_4a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  local_820 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar256 = ZEXT3264(local_820);
  auVar84 = vunpcklps_avx512vl(local_4a0._0_16_,local_820._0_16_);
  local_840 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar255 = ZEXT3264(local_840);
  auVar88 = local_840._0_16_;
  local_7b0 = vinsertps_avx512f(auVar84,auVar88,0x28);
  auVar238 = ZEXT1664(local_7b0);
  auVar90._0_4_ = auVar86._0_4_ + auVar243._0_4_ + auVar87._0_4_ + auVar5._0_4_;
  auVar90._4_4_ = auVar86._4_4_ + auVar243._4_4_ + auVar87._4_4_ + auVar5._4_4_;
  auVar90._8_4_ = auVar86._8_4_ + auVar243._8_4_ + auVar87._8_4_ + auVar5._8_4_;
  auVar90._12_4_ = auVar86._12_4_ + auVar243._12_4_ + auVar87._12_4_ + auVar5._12_4_;
  auVar89._8_4_ = 0x3e800000;
  auVar89._0_8_ = 0x3e8000003e800000;
  auVar89._12_4_ = 0x3e800000;
  auVar84 = vmulps_avx512vl(auVar90,auVar89);
  auVar84 = vsubps_avx(auVar84,auVar215);
  auVar84 = vdpps_avx(auVar84,local_7b0,0x7f);
  fVar206 = *(float *)(ray + k * 4 + 0x30);
  auVar244 = ZEXT464((uint)fVar206);
  local_7c0 = vdpps_avx(local_7b0,local_7b0,0x7f);
  auVar227._4_12_ = ZEXT812(0) << 0x20;
  auVar227._0_4_ = local_7c0._0_4_;
  auVar85 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar227);
  auVar6 = vfnmadd213ss_fma(auVar85,local_7c0,ZEXT416(0x40000000));
  local_400 = auVar84._0_4_ * auVar85._0_4_ * auVar6._0_4_;
  auVar226 = ZEXT464((uint)local_400);
  auVar228._4_4_ = local_400;
  auVar228._0_4_ = local_400;
  auVar228._8_4_ = local_400;
  auVar228._12_4_ = local_400;
  fStack_670 = local_400;
  _local_680 = auVar228;
  fStack_66c = local_400;
  fStack_668 = local_400;
  fStack_664 = local_400;
  auVar84 = vfmadd231ps_fma(auVar215,local_7b0,auVar228);
  auVar84 = vblendps_avx(auVar84,ZEXT816(0) << 0x40,8);
  auVar86 = vsubps_avx(auVar86,auVar84);
  auVar87 = vsubps_avx(auVar87,auVar84);
  auVar243 = vsubps_avx(auVar243,auVar84);
  auVar237 = ZEXT1664(auVar243);
  auVar5 = vsubps_avx(auVar5,auVar84);
  local_1e0 = auVar86._0_4_;
  fStack_1dc = local_1e0;
  fStack_1d8 = local_1e0;
  fStack_1d4 = local_1e0;
  fStack_1d0 = local_1e0;
  fStack_1cc = local_1e0;
  fStack_1c8 = local_1e0;
  fStack_1c4 = local_1e0;
  auVar116._8_4_ = 1;
  auVar116._0_8_ = 0x100000001;
  auVar116._12_4_ = 1;
  auVar116._16_4_ = 1;
  auVar116._20_4_ = 1;
  auVar116._24_4_ = 1;
  auVar116._28_4_ = 1;
  local_740 = ZEXT1632(auVar86);
  local_200 = vpermps_avx2(auVar116,local_740);
  auVar119._8_4_ = 2;
  auVar119._0_8_ = 0x200000002;
  auVar119._12_4_ = 2;
  auVar119._16_4_ = 2;
  auVar119._20_4_ = 2;
  auVar119._24_4_ = 2;
  auVar119._28_4_ = 2;
  local_220 = vpermps_avx2(auVar119,local_740);
  auVar120._8_4_ = 3;
  auVar120._0_8_ = 0x300000003;
  auVar120._12_4_ = 3;
  auVar120._16_4_ = 3;
  auVar120._20_4_ = 3;
  auVar120._24_4_ = 3;
  auVar120._28_4_ = 3;
  local_240 = vpermps_avx2(auVar120,local_740);
  local_260 = auVar243._0_4_;
  uStack_25c = local_260;
  uStack_258 = local_260;
  uStack_254 = local_260;
  uStack_250 = local_260;
  uStack_24c = local_260;
  uStack_248 = local_260;
  uStack_244 = local_260;
  local_780 = ZEXT1632(auVar243);
  local_280 = vpermps_avx2(auVar116,local_780);
  local_2a0 = vpermps_avx2(auVar119,local_780);
  local_2c0 = vpermps_avx2(auVar120,local_780);
  local_2e0 = auVar87._0_4_;
  uStack_2dc = local_2e0;
  uStack_2d8 = local_2e0;
  uStack_2d4 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2cc = local_2e0;
  uStack_2c8 = local_2e0;
  uStack_2c4 = local_2e0;
  local_760 = ZEXT1632(auVar87);
  local_300 = vpermps_avx2(auVar116,local_760);
  local_320 = vpermps_avx2(auVar119,local_760);
  local_340 = vpermps_avx2(auVar120,local_760);
  local_360 = auVar5._0_4_;
  uStack_35c = local_360;
  uStack_358 = local_360;
  uStack_354 = local_360;
  uStack_350 = local_360;
  uStack_34c = local_360;
  uStack_348 = local_360;
  uStack_344 = local_360;
  _local_7a0 = ZEXT1632(auVar5);
  local_380 = vpermps_avx2(auVar116,_local_7a0);
  local_3a0 = vpermps_avx2(auVar119,_local_7a0);
  local_3c0 = vpermps_avx2(auVar120,_local_7a0);
  auVar86 = vmulss_avx512f(auVar88,auVar88);
  auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),local_820,local_820);
  local_4c0 = vfmadd231ps_avx512vl(auVar96,local_4a0,local_4a0);
  local_3e0._0_4_ = local_4c0._0_4_;
  local_3e0._4_4_ = local_3e0._0_4_;
  local_3e0._8_4_ = local_3e0._0_4_;
  local_3e0._12_4_ = local_3e0._0_4_;
  local_3e0._16_4_ = local_3e0._0_4_;
  local_3e0._20_4_ = local_3e0._0_4_;
  local_3e0._24_4_ = local_3e0._0_4_;
  local_3e0._28_4_ = local_3e0._0_4_;
  auVar115._8_4_ = 0x7fffffff;
  auVar115._0_8_ = 0x7fffffff7fffffff;
  auVar115._12_4_ = 0x7fffffff;
  auVar115._16_4_ = 0x7fffffff;
  auVar115._20_4_ = 0x7fffffff;
  auVar115._24_4_ = 0x7fffffff;
  auVar115._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_3e0,auVar115);
  local_700 = ZEXT416((uint)local_400);
  local_400 = fVar206 - local_400;
  fStack_3fc = local_400;
  fStack_3f8 = local_400;
  fStack_3f4 = local_400;
  fStack_3f0 = local_400;
  fStack_3ec = local_400;
  fStack_3e8 = local_400;
  fStack_3e4 = local_400;
  local_610 = vpbroadcastd_avx512vl();
  local_858 = 1;
  local_850 = 0;
  local_620 = vpbroadcastd_avx512vl();
  auVar86 = vsqrtss_avx(local_7c0,local_7c0);
  local_8d4 = auVar86._0_4_;
  auVar86 = vsqrtss_avx(local_7c0,local_7c0);
  local_8d8 = auVar86._0_4_;
  auVar201 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar254 = ZEXT3264(auVar96);
  do {
    local_870 = auVar201._0_16_;
    auVar86 = vmovshdup_avx(local_870);
    fVar143 = auVar201._0_4_;
    fVar247 = auVar86._0_4_ - fVar143;
    fVar188 = fVar247 * 0.04761905;
    auVar220._4_4_ = fVar143;
    auVar220._0_4_ = fVar143;
    auVar220._8_4_ = fVar143;
    auVar220._12_4_ = fVar143;
    auVar220._16_4_ = fVar143;
    auVar220._20_4_ = fVar143;
    auVar220._24_4_ = fVar143;
    auVar220._28_4_ = fVar143;
    local_7e0._4_4_ = fVar247;
    local_7e0._0_4_ = fVar247;
    local_7e0._8_4_ = fVar247;
    local_7e0._12_4_ = fVar247;
    local_7e0._16_4_ = fVar247;
    local_7e0._20_4_ = fVar247;
    local_7e0._24_4_ = fVar247;
    local_7e0._28_4_ = fVar247;
    auVar86 = vfmadd231ps_fma(auVar220,local_7e0,_DAT_02020f20);
    auVar94 = vsubps_avx512vl(auVar254._0_32_,ZEXT1632(auVar86));
    fVar143 = auVar94._0_4_;
    fVar231 = auVar94._4_4_;
    fVar239 = auVar94._8_4_;
    fVar241 = auVar94._12_4_;
    fVar233 = auVar94._16_4_;
    fVar225 = auVar94._20_4_;
    fVar242 = auVar94._24_4_;
    fVar144 = fVar143 * fVar143 * fVar143;
    fVar163 = fVar231 * fVar231 * fVar231;
    auVar36._4_4_ = fVar163;
    auVar36._0_4_ = fVar144;
    fVar164 = fVar239 * fVar239 * fVar239;
    auVar36._8_4_ = fVar164;
    fVar165 = fVar241 * fVar241 * fVar241;
    auVar36._12_4_ = fVar165;
    fVar166 = fVar233 * fVar233 * fVar233;
    auVar36._16_4_ = fVar166;
    fVar167 = fVar225 * fVar225 * fVar225;
    auVar36._20_4_ = fVar167;
    fVar168 = fVar242 * fVar242 * fVar242;
    auVar36._24_4_ = fVar168;
    auVar36._28_4_ = fVar247;
    auVar95 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar96 = vmulps_avx512vl(auVar36,auVar95);
    fVar230 = auVar86._0_4_;
    fVar232 = auVar86._4_4_;
    fVar240 = auVar86._8_4_;
    fVar205 = auVar86._12_4_;
    fVar187 = fVar230 * fVar230 * fVar230;
    fVar202 = fVar232 * fVar232 * fVar232;
    fVar203 = fVar240 * fVar240 * fVar240;
    fVar204 = fVar205 * fVar205 * fVar205;
    auVar201._0_28_ = ZEXT1628(CONCAT412(fVar204,CONCAT48(fVar203,CONCAT44(fVar202,fVar187))));
    auVar254._0_4_ = fVar230 * fVar143;
    auVar254._4_4_ = fVar232 * fVar231;
    auVar254._8_4_ = fVar240 * fVar239;
    auVar254._12_4_ = fVar205 * fVar241;
    auVar254._16_4_ = fVar233 * 0.0;
    auVar254._20_4_ = fVar225 * 0.0;
    auVar254._28_36_ = auVar244._28_36_;
    auVar254._24_4_ = fVar242 * 0.0;
    auVar97 = vmulps_avx512vl(auVar201._0_32_,auVar95);
    fVar247 = auVar97._28_4_ + fVar247;
    auVar37._4_4_ = fVar163 * 0.16666667;
    auVar37._0_4_ = fVar144 * 0.16666667;
    auVar37._8_4_ = fVar164 * 0.16666667;
    auVar37._12_4_ = fVar165 * 0.16666667;
    auVar37._16_4_ = fVar166 * 0.16666667;
    auVar37._20_4_ = fVar167 * 0.16666667;
    auVar37._24_4_ = fVar168 * 0.16666667;
    auVar37._28_4_ = fVar247;
    auVar38._4_4_ =
         (auVar254._4_4_ * fVar231 * 12.0 + auVar254._4_4_ * fVar232 * 6.0 + fVar202 + auVar96._4_4_
         ) * 0.16666667;
    auVar38._0_4_ =
         (auVar254._0_4_ * fVar143 * 12.0 + auVar254._0_4_ * fVar230 * 6.0 + fVar187 + auVar96._0_4_
         ) * 0.16666667;
    auVar38._8_4_ =
         (auVar254._8_4_ * fVar239 * 12.0 + auVar254._8_4_ * fVar240 * 6.0 + fVar203 + auVar96._8_4_
         ) * 0.16666667;
    auVar38._12_4_ =
         (auVar254._12_4_ * fVar241 * 12.0 + auVar254._12_4_ * fVar205 * 6.0 +
         fVar204 + auVar96._12_4_) * 0.16666667;
    auVar38._16_4_ =
         (auVar254._16_4_ * fVar233 * 12.0 + auVar254._16_4_ * 0.0 * 6.0 + auVar96._16_4_ + 0.0) *
         0.16666667;
    auVar38._20_4_ =
         (auVar254._20_4_ * fVar225 * 12.0 + auVar254._20_4_ * 0.0 * 6.0 + auVar96._20_4_ + 0.0) *
         0.16666667;
    auVar38._24_4_ =
         (auVar254._24_4_ * fVar242 * 12.0 + auVar254._24_4_ * 0.0 * 6.0 + auVar96._24_4_ + 0.0) *
         0.16666667;
    auVar38._28_4_ = auVar249._28_4_;
    auVar39._4_4_ =
         (auVar97._4_4_ + fVar163 + auVar254._4_4_ * fVar232 * 12.0 + auVar254._4_4_ * fVar231 * 6.0
         ) * 0.16666667;
    auVar39._0_4_ =
         (auVar97._0_4_ + fVar144 + auVar254._0_4_ * fVar230 * 12.0 + auVar254._0_4_ * fVar143 * 6.0
         ) * 0.16666667;
    auVar39._8_4_ =
         (auVar97._8_4_ + fVar164 + auVar254._8_4_ * fVar240 * 12.0 + auVar254._8_4_ * fVar239 * 6.0
         ) * 0.16666667;
    auVar39._12_4_ =
         (auVar97._12_4_ + fVar165 +
         auVar254._12_4_ * fVar205 * 12.0 + auVar254._12_4_ * fVar241 * 6.0) * 0.16666667;
    auVar39._16_4_ =
         (auVar97._16_4_ + fVar166 + auVar254._16_4_ * 0.0 * 12.0 + auVar254._16_4_ * fVar233 * 6.0)
         * 0.16666667;
    auVar39._20_4_ =
         (auVar97._20_4_ + fVar167 + auVar254._20_4_ * 0.0 * 12.0 + auVar254._20_4_ * fVar225 * 6.0)
         * 0.16666667;
    auVar39._24_4_ =
         (auVar97._24_4_ + fVar168 + auVar254._24_4_ * 0.0 * 12.0 + auVar254._24_4_ * fVar242 * 6.0)
         * 0.16666667;
    auVar39._28_4_ = auVar253._28_4_;
    auVar40._28_4_ = fVar247 + auVar249._28_4_ + auVar226._28_4_;
    auVar40._0_28_ =
         ZEXT1628(CONCAT412(fVar204 * 0.16666667,
                            CONCAT48(fVar203 * 0.16666667,
                                     CONCAT44(fVar202 * 0.16666667,fVar187 * 0.16666667))));
    auVar69._4_4_ = uStack_35c;
    auVar69._0_4_ = local_360;
    auVar69._8_4_ = uStack_358;
    auVar69._12_4_ = uStack_354;
    auVar69._16_4_ = uStack_350;
    auVar69._20_4_ = uStack_34c;
    auVar69._24_4_ = uStack_348;
    auVar69._28_4_ = uStack_344;
    auVar96 = vmulps_avx512vl(auVar69,auVar40);
    auVar97 = vmulps_avx512vl(local_380,auVar40);
    auVar98 = vmulps_avx512vl(local_3a0,auVar40);
    auVar99 = vmulps_avx512vl(local_3c0,auVar40);
    auVar70._4_4_ = uStack_2dc;
    auVar70._0_4_ = local_2e0;
    auVar70._8_4_ = uStack_2d8;
    auVar70._12_4_ = uStack_2d4;
    auVar70._16_4_ = uStack_2d0;
    auVar70._20_4_ = uStack_2cc;
    auVar70._24_4_ = uStack_2c8;
    auVar70._28_4_ = uStack_2c4;
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar39,auVar70);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar39,local_300);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar39,local_320);
    auVar99 = vfmadd231ps_avx512vl(auVar99,local_340,auVar39);
    auVar71._4_4_ = uStack_25c;
    auVar71._0_4_ = local_260;
    auVar71._8_4_ = uStack_258;
    auVar71._12_4_ = uStack_254;
    auVar71._16_4_ = uStack_250;
    auVar71._20_4_ = uStack_24c;
    auVar71._24_4_ = uStack_248;
    auVar71._28_4_ = uStack_244;
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar38,auVar71);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar38,local_280);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar38,local_2a0);
    auVar99 = vfmadd231ps_avx512vl(auVar99,local_2c0,auVar38);
    auVar72._4_4_ = fStack_1dc;
    auVar72._0_4_ = local_1e0;
    auVar72._8_4_ = fStack_1d8;
    auVar72._12_4_ = fStack_1d4;
    auVar72._16_4_ = fStack_1d0;
    auVar72._20_4_ = fStack_1cc;
    auVar72._24_4_ = fStack_1c8;
    auVar72._28_4_ = fStack_1c4;
    auVar243 = vfmadd231ps_fma(auVar96,auVar37,auVar72);
    auVar87 = vfmadd231ps_fma(auVar97,auVar37,local_200);
    auVar5 = vfmadd231ps_fma(auVar98,auVar37,local_220);
    auVar84 = vfmadd231ps_fma(auVar99,local_240,auVar37);
    auVar96 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar97 = vxorps_avx512vl(auVar94,auVar96);
    auVar98 = vxorps_avx512vl(ZEXT1632(auVar86),auVar96);
    auVar221._0_4_ = auVar98._0_4_ * fVar230;
    auVar221._4_4_ = auVar98._4_4_ * fVar232;
    auVar221._8_4_ = auVar98._8_4_ * fVar240;
    auVar221._12_4_ = auVar98._12_4_ * fVar205;
    auVar221._16_4_ = auVar98._16_4_ * 0.0;
    auVar221._20_4_ = auVar98._20_4_ * 0.0;
    auVar221._24_4_ = auVar98._24_4_ * 0.0;
    auVar221._28_4_ = 0;
    auVar99 = vmulps_avx512vl(auVar254._0_32_,auVar95);
    auVar96 = vsubps_avx(auVar221,auVar99);
    auVar41._4_4_ = auVar97._4_4_ * fVar231 * 0.5;
    auVar41._0_4_ = auVar97._0_4_ * fVar143 * 0.5;
    auVar41._8_4_ = auVar97._8_4_ * fVar239 * 0.5;
    auVar41._12_4_ = auVar97._12_4_ * fVar241 * 0.5;
    auVar41._16_4_ = auVar97._16_4_ * fVar233 * 0.5;
    auVar41._20_4_ = auVar97._20_4_ * fVar225 * 0.5;
    auVar41._24_4_ = auVar97._24_4_ * fVar242 * 0.5;
    auVar41._28_4_ = auVar94._28_4_;
    auVar42._4_4_ = auVar96._4_4_ * 0.5;
    auVar42._0_4_ = auVar96._0_4_ * 0.5;
    auVar42._8_4_ = auVar96._8_4_ * 0.5;
    auVar42._12_4_ = auVar96._12_4_ * 0.5;
    auVar42._16_4_ = auVar96._16_4_ * 0.5;
    auVar42._20_4_ = auVar96._20_4_ * 0.5;
    auVar42._24_4_ = auVar96._24_4_ * 0.5;
    auVar42._28_4_ = auVar96._28_4_;
    auVar43._4_4_ = (fVar231 * fVar231 + auVar99._4_4_) * 0.5;
    auVar43._0_4_ = (fVar143 * fVar143 + auVar99._0_4_) * 0.5;
    auVar43._8_4_ = (fVar239 * fVar239 + auVar99._8_4_) * 0.5;
    auVar43._12_4_ = (fVar241 * fVar241 + auVar99._12_4_) * 0.5;
    auVar43._16_4_ = (fVar233 * fVar233 + auVar99._16_4_) * 0.5;
    auVar43._20_4_ = (fVar225 * fVar225 + auVar99._20_4_) * 0.5;
    auVar43._24_4_ = (fVar242 * fVar242 + auVar99._24_4_) * 0.5;
    auVar43._28_4_ = auVar237._28_4_ + auVar99._28_4_;
    auVar44._28_4_ = auVar238._28_4_;
    auVar44._0_28_ =
         ZEXT1628(CONCAT412(fVar205 * fVar205 * 0.5,
                            CONCAT48(fVar240 * fVar240 * 0.5,
                                     CONCAT44(fVar232 * fVar232 * 0.5,fVar230 * fVar230 * 0.5))));
    auVar96 = vmulps_avx512vl(auVar69,auVar44);
    auVar94 = vmulps_avx512vl(local_380,auVar44);
    auVar97 = vmulps_avx512vl(local_3a0,auVar44);
    auVar99 = vmulps_avx512vl(local_3c0,auVar44);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar43,auVar70);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar43,local_300);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar43,local_320);
    auVar99 = vfmadd231ps_avx512vl(auVar99,local_340,auVar43);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar42,auVar71);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar42,local_280);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar42,local_2a0);
    auVar99 = vfmadd231ps_avx512vl(auVar99,local_2c0,auVar42);
    auVar86 = vfmadd231ps_fma(auVar96,auVar41,auVar72);
    auVar215 = vfmadd231ps_fma(auVar94,auVar41,local_200);
    auVar6 = vfmadd231ps_fma(auVar97,auVar41,local_220);
    auVar85 = vfmadd231ps_fma(auVar99,local_240,auVar41);
    auVar45._4_4_ = auVar86._4_4_ * fVar188;
    auVar45._0_4_ = auVar86._0_4_ * fVar188;
    auVar45._8_4_ = auVar86._8_4_ * fVar188;
    auVar45._12_4_ = auVar86._12_4_ * fVar188;
    auVar45._16_4_ = fVar188 * 0.0;
    auVar45._20_4_ = fVar188 * 0.0;
    auVar45._24_4_ = fVar188 * 0.0;
    auVar45._28_4_ = auVar98._28_4_;
    auVar248._0_4_ = auVar215._0_4_ * fVar188;
    auVar248._4_4_ = auVar215._4_4_ * fVar188;
    auVar248._8_4_ = auVar215._8_4_ * fVar188;
    auVar248._12_4_ = auVar215._12_4_ * fVar188;
    auVar248._16_4_ = fVar188 * 0.0;
    auVar248._20_4_ = fVar188 * 0.0;
    auVar248._24_4_ = fVar188 * 0.0;
    auVar248._28_4_ = 0;
    auVar249 = ZEXT3264(auVar248);
    auVar252._0_4_ = auVar6._0_4_ * fVar188;
    auVar252._4_4_ = auVar6._4_4_ * fVar188;
    auVar252._8_4_ = auVar6._8_4_ * fVar188;
    auVar252._12_4_ = auVar6._12_4_ * fVar188;
    auVar252._16_4_ = fVar188 * 0.0;
    auVar252._20_4_ = fVar188 * 0.0;
    auVar252._24_4_ = fVar188 * 0.0;
    auVar252._28_4_ = 0;
    auVar253 = ZEXT3264(auVar252);
    fVar143 = auVar85._0_4_ * fVar188;
    fVar230 = auVar85._4_4_ * fVar188;
    auVar46._4_4_ = fVar230;
    auVar46._0_4_ = fVar143;
    fVar231 = auVar85._8_4_ * fVar188;
    auVar46._8_4_ = fVar231;
    fVar232 = auVar85._12_4_ * fVar188;
    auVar46._12_4_ = fVar232;
    auVar46._16_4_ = fVar188 * 0.0;
    auVar46._20_4_ = fVar188 * 0.0;
    auVar46._24_4_ = fVar188 * 0.0;
    auVar46._28_4_ = fStack_1c4;
    auVar86 = vxorps_avx512vl(auVar256._0_16_,auVar256._0_16_);
    auVar100 = vpermt2ps_avx512vl(ZEXT1632(auVar243),_DAT_0205fd20,ZEXT1632(auVar86));
    auVar237 = ZEXT3264(auVar100);
    auVar101 = vpermt2ps_avx512vl(ZEXT1632(auVar87),_DAT_0205fd20,ZEXT1632(auVar86));
    auVar238 = ZEXT3264(auVar101);
    auVar97 = ZEXT1632(auVar86);
    auVar102 = vpermt2ps_avx512vl(ZEXT1632(auVar5),_DAT_0205fd20,auVar97);
    auVar244 = ZEXT3264(auVar102);
    auVar222._0_4_ = fVar143 + auVar84._0_4_;
    auVar222._4_4_ = fVar230 + auVar84._4_4_;
    auVar222._8_4_ = fVar231 + auVar84._8_4_;
    auVar222._12_4_ = fVar232 + auVar84._12_4_;
    auVar222._16_4_ = fVar188 * 0.0 + 0.0;
    auVar222._20_4_ = fVar188 * 0.0 + 0.0;
    auVar222._24_4_ = fVar188 * 0.0 + 0.0;
    auVar222._28_4_ = fStack_1c4 + 0.0;
    auVar96 = vmaxps_avx(ZEXT1632(auVar84),auVar222);
    auVar94 = vminps_avx(ZEXT1632(auVar84),auVar222);
    auVar103 = vpermt2ps_avx512vl(ZEXT1632(auVar84),_DAT_0205fd20,auVar97);
    auVar93 = vpermt2ps_avx512vl(auVar45,_DAT_0205fd20,auVar97);
    auVar104 = vpermt2ps_avx512vl(auVar248,_DAT_0205fd20,auVar97);
    auVar115 = ZEXT1632(auVar86);
    auVar105 = vpermt2ps_avx512vl(auVar252,_DAT_0205fd20,auVar115);
    auVar226 = ZEXT3264(auVar105);
    auVar97 = vpermt2ps_avx512vl(auVar46,_DAT_0205fd20,auVar115);
    auVar91 = vsubps_avx512vl(auVar103,auVar97);
    auVar97 = vsubps_avx(auVar100,ZEXT1632(auVar243));
    auVar98 = vsubps_avx(auVar101,ZEXT1632(auVar87));
    local_660 = vsubps_avx512vl(auVar102,ZEXT1632(auVar5));
    auVar99 = vmulps_avx512vl(auVar98,auVar252);
    auVar99 = vfmsub231ps_avx512vl(auVar99,auVar248,local_660);
    auVar92 = vmulps_avx512vl(local_660,auVar45);
    auVar92 = vfmsub231ps_avx512vl(auVar92,auVar252,auVar97);
    auVar106 = vmulps_avx512vl(auVar97,auVar248);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar45,auVar98);
    auVar106 = vmulps_avx512vl(auVar106,auVar106);
    auVar92 = vfmadd231ps_avx512vl(auVar106,auVar92,auVar92);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar99,auVar99);
    auVar99 = vmulps_avx512vl(local_660,local_660);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar98,auVar98);
    auVar106 = vfmadd231ps_avx512vl(auVar99,auVar97,auVar97);
    auVar107 = vrcp14ps_avx512vl(auVar106);
    auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar108 = vfnmadd213ps_avx512vl(auVar107,auVar106,auVar99);
    auVar107 = vfmadd132ps_avx512vl(auVar108,auVar107,auVar107);
    auVar92 = vmulps_avx512vl(auVar92,auVar107);
    auVar108 = vmulps_avx512vl(auVar98,auVar105);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar104,local_660);
    auVar109 = vmulps_avx512vl(local_660,auVar93);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar105,auVar97);
    auVar110 = vmulps_avx512vl(auVar97,auVar104);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar93,auVar98);
    auVar110 = vmulps_avx512vl(auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar107 = vmulps_avx512vl(auVar108,auVar107);
    auVar92 = vmaxps_avx512vl(auVar92,auVar107);
    auVar92 = vsqrtps_avx512vl(auVar92);
    auVar107 = vmaxps_avx512vl(auVar91,auVar103);
    auVar96 = vmaxps_avx512vl(auVar96,auVar107);
    auVar107 = vaddps_avx512vl(auVar92,auVar96);
    auVar96 = vminps_avx512vl(auVar91,auVar103);
    auVar96 = vminps_avx(auVar94,auVar96);
    auVar96 = vsubps_avx512vl(auVar96,auVar92);
    auVar121._8_4_ = 0x3f800002;
    auVar121._0_8_ = 0x3f8000023f800002;
    auVar121._12_4_ = 0x3f800002;
    auVar121._16_4_ = 0x3f800002;
    auVar121._20_4_ = 0x3f800002;
    auVar121._24_4_ = 0x3f800002;
    auVar121._28_4_ = 0x3f800002;
    auVar94 = vmulps_avx512vl(auVar107,auVar121);
    auVar122._8_4_ = 0x3f7ffffc;
    auVar122._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar122._12_4_ = 0x3f7ffffc;
    auVar122._16_4_ = 0x3f7ffffc;
    auVar122._20_4_ = 0x3f7ffffc;
    auVar122._24_4_ = 0x3f7ffffc;
    auVar122._28_4_ = 0x3f7ffffc;
    auVar103 = vmulps_avx512vl(auVar96,auVar122);
    auVar47._4_4_ = auVar94._4_4_ * auVar94._4_4_;
    auVar47._0_4_ = auVar94._0_4_ * auVar94._0_4_;
    auVar47._8_4_ = auVar94._8_4_ * auVar94._8_4_;
    auVar47._12_4_ = auVar94._12_4_ * auVar94._12_4_;
    auVar47._16_4_ = auVar94._16_4_ * auVar94._16_4_;
    auVar47._20_4_ = auVar94._20_4_ * auVar94._20_4_;
    auVar47._24_4_ = auVar94._24_4_ * auVar94._24_4_;
    auVar47._28_4_ = auVar103._28_4_;
    auVar96 = vrsqrt14ps_avx512vl(auVar106);
    auVar23._8_4_ = 0xbf000000;
    auVar23._0_8_ = 0xbf000000bf000000;
    auVar23._12_4_ = 0xbf000000;
    auVar23._16_4_ = 0xbf000000;
    auVar23._20_4_ = 0xbf000000;
    auVar23._24_4_ = 0xbf000000;
    auVar23._28_4_ = 0xbf000000;
    auVar94 = vmulps_avx512vl(auVar106,auVar23);
    auVar48._4_4_ = auVar96._4_4_ * auVar94._4_4_;
    auVar48._0_4_ = auVar96._0_4_ * auVar94._0_4_;
    auVar48._8_4_ = auVar96._8_4_ * auVar94._8_4_;
    auVar48._12_4_ = auVar96._12_4_ * auVar94._12_4_;
    auVar48._16_4_ = auVar96._16_4_ * auVar94._16_4_;
    auVar48._20_4_ = auVar96._20_4_ * auVar94._20_4_;
    auVar48._24_4_ = auVar96._24_4_ * auVar94._24_4_;
    auVar48._28_4_ = auVar94._28_4_;
    auVar94 = vmulps_avx512vl(auVar96,auVar96);
    auVar94 = vmulps_avx512vl(auVar94,auVar48);
    auVar24._8_4_ = 0x3fc00000;
    auVar24._0_8_ = 0x3fc000003fc00000;
    auVar24._12_4_ = 0x3fc00000;
    auVar24._16_4_ = 0x3fc00000;
    auVar24._20_4_ = 0x3fc00000;
    auVar24._24_4_ = 0x3fc00000;
    auVar24._28_4_ = 0x3fc00000;
    auVar91 = vfmadd231ps_avx512vl(auVar94,auVar96,auVar24);
    auVar49._4_4_ = auVar91._4_4_ * auVar97._4_4_;
    auVar49._0_4_ = auVar91._0_4_ * auVar97._0_4_;
    auVar49._8_4_ = auVar91._8_4_ * auVar97._8_4_;
    auVar49._12_4_ = auVar91._12_4_ * auVar97._12_4_;
    auVar49._16_4_ = auVar91._16_4_ * auVar97._16_4_;
    auVar49._20_4_ = auVar91._20_4_ * auVar97._20_4_;
    auVar49._24_4_ = auVar91._24_4_ * auVar97._24_4_;
    auVar49._28_4_ = auVar96._28_4_;
    auVar96 = vmulps_avx512vl(auVar98,auVar91);
    auVar94 = vmulps_avx512vl(local_660,auVar91);
    local_8a0 = ZEXT1632(auVar243);
    auVar92 = vsubps_avx512vl(auVar115,local_8a0);
    auVar199 = ZEXT1632(auVar87);
    auVar106 = vsubps_avx512vl(auVar115,auVar199);
    local_800 = ZEXT1632(auVar5);
    auVar107 = vsubps_avx512vl(auVar115,local_800);
    auVar108 = vmulps_avx512vl(auVar255._0_32_,auVar107);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar256._0_32_,auVar106);
    auVar108 = vfmadd231ps_avx512vl(auVar108,local_4a0,auVar92);
    auVar109 = vmulps_avx512vl(auVar107,auVar107);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar106,auVar106);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar92,auVar92);
    auVar110 = vmulps_avx512vl(auVar255._0_32_,auVar94);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar96,auVar256._0_32_);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar49,local_4a0);
    auVar94 = vmulps_avx512vl(auVar107,auVar94);
    auVar96 = vfmadd231ps_avx512vl(auVar94,auVar106,auVar96);
    auVar111 = vfmadd231ps_avx512vl(auVar96,auVar92,auVar49);
    auVar112 = vmulps_avx512vl(auVar110,auVar110);
    auVar96 = vsubps_avx(local_3e0,auVar112);
    auVar94 = vmulps_avx512vl(auVar110,auVar111);
    auVar94 = vsubps_avx512vl(auVar108,auVar94);
    auVar108 = vaddps_avx512vl(auVar94,auVar94);
    auVar94 = vmulps_avx512vl(auVar111,auVar111);
    auVar109 = vsubps_avx512vl(auVar109,auVar94);
    auVar94 = vsubps_avx(auVar109,auVar47);
    auVar113 = vmulps_avx512vl(auVar108,auVar108);
    auVar95 = vmulps_avx512vl(auVar96,auVar95);
    auVar114 = vmulps_avx512vl(auVar95,auVar94);
    auVar114 = vsubps_avx512vl(auVar113,auVar114);
    uVar82 = vcmpps_avx512vl(auVar114,auVar115,5);
    bVar73 = (byte)uVar82;
    if (bVar73 == 0) {
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar114 = vsqrtps_avx512vl(auVar114);
      auVar115 = vaddps_avx512vl(auVar96,auVar96);
      auVar116 = vrcp14ps_avx512vl(auVar115);
      auVar99 = vfnmadd213ps_avx512vl(auVar115,auVar116,auVar99);
      auVar99 = vfmadd132ps_avx512vl(auVar99,auVar116,auVar116);
      auVar25._8_4_ = 0x80000000;
      auVar25._0_8_ = 0x8000000080000000;
      auVar25._12_4_ = 0x80000000;
      auVar25._16_4_ = 0x80000000;
      auVar25._20_4_ = 0x80000000;
      auVar25._24_4_ = 0x80000000;
      auVar25._28_4_ = 0x80000000;
      auVar115 = vxorps_avx512vl(auVar108,auVar25);
      auVar115 = vsubps_avx512vl(auVar115,auVar114);
      auVar115 = vmulps_avx512vl(auVar115,auVar99);
      auVar114 = vsubps_avx512vl(auVar114,auVar108);
      auVar99 = vmulps_avx512vl(auVar114,auVar99);
      auVar114 = vfmadd213ps_avx512vl(auVar110,auVar115,auVar111);
      local_500 = vmulps_avx512vl(auVar91,auVar114);
      auVar114 = vfmadd213ps_avx512vl(auVar110,auVar99,auVar111);
      local_520 = vmulps_avx512vl(auVar91,auVar114);
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar114 = vblendmps_avx512vl(auVar114,auVar115);
      auVar117._0_4_ =
           (uint)(bVar73 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar73 & 1) * local_520._0_4_;
      bVar11 = (bool)((byte)(uVar82 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar11 * auVar114._4_4_ | (uint)!bVar11 * local_520._4_4_;
      bVar11 = (bool)((byte)(uVar82 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar11 * auVar114._8_4_ | (uint)!bVar11 * local_520._8_4_;
      bVar11 = (bool)((byte)(uVar82 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar11 * auVar114._12_4_ | (uint)!bVar11 * local_520._12_4_;
      bVar11 = (bool)((byte)(uVar82 >> 4) & 1);
      auVar117._16_4_ = (uint)bVar11 * auVar114._16_4_ | (uint)!bVar11 * local_520._16_4_;
      bVar11 = (bool)((byte)(uVar82 >> 5) & 1);
      auVar117._20_4_ = (uint)bVar11 * auVar114._20_4_ | (uint)!bVar11 * local_520._20_4_;
      bVar11 = (bool)((byte)(uVar82 >> 6) & 1);
      auVar117._24_4_ = (uint)bVar11 * auVar114._24_4_ | (uint)!bVar11 * local_520._24_4_;
      bVar11 = SUB81(uVar82 >> 7,0);
      auVar117._28_4_ = (uint)bVar11 * auVar114._28_4_ | (uint)!bVar11 * local_520._28_4_;
      auVar211._8_4_ = 0xff800000;
      auVar211._0_8_ = 0xff800000ff800000;
      auVar211._12_4_ = 0xff800000;
      auVar211._16_4_ = 0xff800000;
      auVar211._20_4_ = 0xff800000;
      auVar211._24_4_ = 0xff800000;
      auVar211._28_4_ = 0xff800000;
      auVar114 = vblendmps_avx512vl(auVar211,auVar99);
      auVar118._0_4_ =
           (uint)(bVar73 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar99._0_4_;
      bVar11 = (bool)((byte)(uVar82 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar11 * auVar114._4_4_ | (uint)!bVar11 * auVar99._4_4_;
      bVar11 = (bool)((byte)(uVar82 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar11 * auVar114._8_4_ | (uint)!bVar11 * auVar99._8_4_;
      bVar11 = (bool)((byte)(uVar82 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar11 * auVar114._12_4_ | (uint)!bVar11 * auVar99._12_4_;
      bVar11 = (bool)((byte)(uVar82 >> 4) & 1);
      auVar118._16_4_ = (uint)bVar11 * auVar114._16_4_ | (uint)!bVar11 * auVar99._16_4_;
      bVar11 = (bool)((byte)(uVar82 >> 5) & 1);
      auVar118._20_4_ = (uint)bVar11 * auVar114._20_4_ | (uint)!bVar11 * auVar99._20_4_;
      bVar11 = (bool)((byte)(uVar82 >> 6) & 1);
      auVar118._24_4_ = (uint)bVar11 * auVar114._24_4_ | (uint)!bVar11 * auVar99._24_4_;
      bVar11 = SUB81(uVar82 >> 7,0);
      auVar118._28_4_ = (uint)bVar11 * auVar114._28_4_ | (uint)!bVar11 * auVar99._28_4_;
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar112,auVar99);
      auVar114 = vmaxps_avx512vl(local_4c0,auVar99);
      auVar26._8_4_ = 0x36000000;
      auVar26._0_8_ = 0x3600000036000000;
      auVar26._12_4_ = 0x36000000;
      auVar26._16_4_ = 0x36000000;
      auVar26._20_4_ = 0x36000000;
      auVar26._24_4_ = 0x36000000;
      auVar26._28_4_ = 0x36000000;
      auVar114 = vmulps_avx512vl(auVar114,auVar26);
      vandps_avx512vl(auVar96,auVar99);
      uVar78 = vcmpps_avx512vl(auVar114,auVar114,1);
      uVar82 = uVar82 & uVar78;
      bVar77 = (byte)uVar82;
      if (bVar77 != 0) {
        uVar78 = vcmpps_avx512vl(auVar94,_DAT_02020f00,2);
        auVar224._8_4_ = 0xff800000;
        auVar224._0_8_ = 0xff800000ff800000;
        auVar224._12_4_ = 0xff800000;
        auVar224._16_4_ = 0xff800000;
        auVar224._20_4_ = 0xff800000;
        auVar224._24_4_ = 0xff800000;
        auVar224._28_4_ = 0xff800000;
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar99 = vblendmps_avx512vl(auVar94,auVar224);
        bVar75 = (byte)uVar78;
        uVar83 = (uint)(bVar75 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar114._0_4_;
        bVar11 = (bool)((byte)(uVar78 >> 1) & 1);
        uVar136 = (uint)bVar11 * auVar99._4_4_ | (uint)!bVar11 * auVar114._4_4_;
        bVar11 = (bool)((byte)(uVar78 >> 2) & 1);
        uVar137 = (uint)bVar11 * auVar99._8_4_ | (uint)!bVar11 * auVar114._8_4_;
        bVar11 = (bool)((byte)(uVar78 >> 3) & 1);
        uVar138 = (uint)bVar11 * auVar99._12_4_ | (uint)!bVar11 * auVar114._12_4_;
        bVar11 = (bool)((byte)(uVar78 >> 4) & 1);
        uVar139 = (uint)bVar11 * auVar99._16_4_ | (uint)!bVar11 * auVar114._16_4_;
        bVar11 = (bool)((byte)(uVar78 >> 5) & 1);
        uVar140 = (uint)bVar11 * auVar99._20_4_ | (uint)!bVar11 * auVar114._20_4_;
        bVar11 = (bool)((byte)(uVar78 >> 6) & 1);
        uVar141 = (uint)bVar11 * auVar99._24_4_ | (uint)!bVar11 * auVar114._24_4_;
        bVar11 = SUB81(uVar78 >> 7,0);
        uVar142 = (uint)bVar11 * auVar99._28_4_ | (uint)!bVar11 * auVar114._28_4_;
        auVar117._0_4_ = (bVar77 & 1) * uVar83 | !(bool)(bVar77 & 1) * auVar117._0_4_;
        bVar11 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar117._4_4_ = bVar11 * uVar136 | !bVar11 * auVar117._4_4_;
        bVar11 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar117._8_4_ = bVar11 * uVar137 | !bVar11 * auVar117._8_4_;
        bVar11 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar117._12_4_ = bVar11 * uVar138 | !bVar11 * auVar117._12_4_;
        bVar11 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar117._16_4_ = bVar11 * uVar139 | !bVar11 * auVar117._16_4_;
        bVar11 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar117._20_4_ = bVar11 * uVar140 | !bVar11 * auVar117._20_4_;
        bVar11 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar117._24_4_ = bVar11 * uVar141 | !bVar11 * auVar117._24_4_;
        bVar11 = SUB81(uVar82 >> 7,0);
        auVar117._28_4_ = bVar11 * uVar142 | !bVar11 * auVar117._28_4_;
        auVar94 = vblendmps_avx512vl(auVar224,auVar94);
        bVar11 = (bool)((byte)(uVar78 >> 1) & 1);
        bVar12 = (bool)((byte)(uVar78 >> 2) & 1);
        bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
        bVar14 = (bool)((byte)(uVar78 >> 4) & 1);
        bVar15 = (bool)((byte)(uVar78 >> 5) & 1);
        bVar16 = (bool)((byte)(uVar78 >> 6) & 1);
        bVar17 = SUB81(uVar78 >> 7,0);
        auVar118._0_4_ =
             (uint)(bVar77 & 1) *
             ((uint)(bVar75 & 1) * auVar94._0_4_ | !(bool)(bVar75 & 1) * uVar83) |
             !(bool)(bVar77 & 1) * auVar118._0_4_;
        bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar118._4_4_ =
             (uint)bVar81 * ((uint)bVar11 * auVar94._4_4_ | !bVar11 * uVar136) |
             !bVar81 * auVar118._4_4_;
        bVar11 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar118._8_4_ =
             (uint)bVar11 * ((uint)bVar12 * auVar94._8_4_ | !bVar12 * uVar137) |
             !bVar11 * auVar118._8_4_;
        bVar11 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar118._12_4_ =
             (uint)bVar11 * ((uint)bVar13 * auVar94._12_4_ | !bVar13 * uVar138) |
             !bVar11 * auVar118._12_4_;
        bVar11 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar118._16_4_ =
             (uint)bVar11 * ((uint)bVar14 * auVar94._16_4_ | !bVar14 * uVar139) |
             !bVar11 * auVar118._16_4_;
        bVar11 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar118._20_4_ =
             (uint)bVar11 * ((uint)bVar15 * auVar94._20_4_ | !bVar15 * uVar140) |
             !bVar11 * auVar118._20_4_;
        bVar11 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar118._24_4_ =
             (uint)bVar11 * ((uint)bVar16 * auVar94._24_4_ | !bVar16 * uVar141) |
             !bVar11 * auVar118._24_4_;
        bVar11 = SUB81(uVar82 >> 7,0);
        auVar118._28_4_ =
             (uint)bVar11 * ((uint)bVar17 * auVar94._28_4_ | !bVar17 * uVar142) |
             !bVar11 * auVar118._28_4_;
        bVar73 = (~bVar77 | bVar75) & bVar73;
      }
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    }
    auVar254 = ZEXT3264(auVar99);
    if ((bVar73 & 0x7f) == 0) {
      auVar256 = ZEXT3264(local_820);
      auVar255 = ZEXT3264(local_840);
    }
    else {
      fVar143 = *(float *)(ray + k * 4 + 0x80) - (float)local_700._0_4_;
      auVar212._4_4_ = fVar143;
      auVar212._0_4_ = fVar143;
      auVar212._8_4_ = fVar143;
      auVar212._12_4_ = fVar143;
      auVar212._16_4_ = fVar143;
      auVar212._20_4_ = fVar143;
      auVar212._24_4_ = fVar143;
      auVar212._28_4_ = fVar143;
      auVar114 = vminps_avx512vl(auVar212,auVar118);
      auVar68._4_4_ = fStack_3fc;
      auVar68._0_4_ = local_400;
      auVar68._8_4_ = fStack_3f8;
      auVar68._12_4_ = fStack_3f4;
      auVar68._16_4_ = fStack_3f0;
      auVar68._20_4_ = fStack_3ec;
      auVar68._24_4_ = fStack_3e8;
      auVar68._28_4_ = fStack_3e4;
      auVar94 = vmaxps_avx512vl(auVar68,auVar117);
      auVar107 = vmulps_avx512vl(auVar252,auVar107);
      auVar106 = vfmadd213ps_avx512vl(auVar106,auVar248,auVar107);
      auVar92 = vfmadd213ps_avx512vl(auVar92,auVar45,auVar106);
      auVar255 = ZEXT3264(local_840);
      auVar106 = vmulps_avx512vl(local_840,auVar252);
      auVar256 = ZEXT3264(local_820);
      auVar106 = vfmadd231ps_avx512vl(auVar106,local_820,auVar248);
      auVar106 = vfmadd231ps_avx512vl(auVar106,local_4a0,auVar45);
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar106,auVar107);
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar18 = vcmpps_avx512vl(auVar107,auVar115,1);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar92 = vxorps_avx512vl(auVar92,auVar116);
      auVar119 = vrcp14ps_avx512vl(auVar106);
      auVar120 = vxorps_avx512vl(auVar106,auVar116);
      auVar121 = vfnmadd213ps_avx512vl(auVar119,auVar106,auVar99);
      auVar121 = vfmadd132ps_avx512vl(auVar121,auVar119,auVar119);
      auVar92 = vmulps_avx512vl(auVar121,auVar92);
      uVar19 = vcmpps_avx512vl(auVar106,auVar120,1);
      bVar77 = (byte)uVar18 | (byte)uVar19;
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar122 = vblendmps_avx512vl(auVar92,auVar121);
      auVar123._0_4_ =
           (uint)(bVar77 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar119._0_4_;
      bVar11 = (bool)(bVar77 >> 1 & 1);
      auVar123._4_4_ = (uint)bVar11 * auVar122._4_4_ | (uint)!bVar11 * auVar119._4_4_;
      bVar11 = (bool)(bVar77 >> 2 & 1);
      auVar123._8_4_ = (uint)bVar11 * auVar122._8_4_ | (uint)!bVar11 * auVar119._8_4_;
      bVar11 = (bool)(bVar77 >> 3 & 1);
      auVar123._12_4_ = (uint)bVar11 * auVar122._12_4_ | (uint)!bVar11 * auVar119._12_4_;
      bVar11 = (bool)(bVar77 >> 4 & 1);
      auVar123._16_4_ = (uint)bVar11 * auVar122._16_4_ | (uint)!bVar11 * auVar119._16_4_;
      bVar11 = (bool)(bVar77 >> 5 & 1);
      auVar123._20_4_ = (uint)bVar11 * auVar122._20_4_ | (uint)!bVar11 * auVar119._20_4_;
      bVar11 = (bool)(bVar77 >> 6 & 1);
      auVar123._24_4_ = (uint)bVar11 * auVar122._24_4_ | (uint)!bVar11 * auVar119._24_4_;
      auVar123._28_4_ =
           (uint)(bVar77 >> 7) * auVar122._28_4_ | (uint)!(bool)(bVar77 >> 7) * auVar119._28_4_;
      auVar94 = vmaxps_avx(auVar94,auVar123);
      uVar19 = vcmpps_avx512vl(auVar106,auVar120,6);
      bVar77 = (byte)uVar18 | (byte)uVar19;
      auVar253 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar124._0_4_ = (uint)(bVar77 & 1) * 0x7f800000 | (uint)!(bool)(bVar77 & 1) * auVar92._0_4_;
      bVar11 = (bool)(bVar77 >> 1 & 1);
      auVar124._4_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * auVar92._4_4_;
      bVar11 = (bool)(bVar77 >> 2 & 1);
      auVar124._8_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * auVar92._8_4_;
      bVar11 = (bool)(bVar77 >> 3 & 1);
      auVar124._12_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * auVar92._12_4_;
      bVar11 = (bool)(bVar77 >> 4 & 1);
      auVar124._16_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * auVar92._16_4_;
      bVar11 = (bool)(bVar77 >> 5 & 1);
      auVar124._20_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * auVar92._20_4_;
      bVar11 = (bool)(bVar77 >> 6 & 1);
      auVar124._24_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * auVar92._24_4_;
      auVar124._28_4_ =
           (uint)(bVar77 >> 7) * 0x7f800000 | (uint)!(bool)(bVar77 >> 7) * auVar92._28_4_;
      auVar92 = vminps_avx(auVar114,auVar124);
      auVar86 = vxorps_avx512vl(auVar120._0_16_,auVar120._0_16_);
      auVar100 = vsubps_avx512vl(ZEXT1632(auVar86),auVar100);
      auVar101 = vsubps_avx512vl(ZEXT1632(auVar86),auVar101);
      auVar106 = ZEXT1632(auVar86);
      auVar102 = vsubps_avx512vl(auVar106,auVar102);
      auVar50._4_4_ = auVar102._4_4_ * auVar105._4_4_;
      auVar50._0_4_ = auVar102._0_4_ * auVar105._0_4_;
      auVar50._8_4_ = auVar102._8_4_ * auVar105._8_4_;
      auVar50._12_4_ = auVar102._12_4_ * auVar105._12_4_;
      auVar50._16_4_ = auVar102._16_4_ * auVar105._16_4_;
      auVar50._20_4_ = auVar102._20_4_ * auVar105._20_4_;
      auVar50._24_4_ = auVar102._24_4_ * auVar105._24_4_;
      auVar50._28_4_ = auVar102._28_4_;
      auVar101 = vfnmsub231ps_avx512vl(auVar50,auVar104,auVar101);
      auVar100 = vfnmadd231ps_avx512vl(auVar101,auVar93,auVar100);
      auVar101 = vmulps_avx512vl(local_840,auVar105);
      auVar101 = vfnmsub231ps_avx512vl(auVar101,local_820,auVar104);
      auVar101 = vfnmadd231ps_avx512vl(auVar101,local_4a0,auVar93);
      vandps_avx512vl(auVar101,auVar107);
      uVar18 = vcmpps_avx512vl(auVar101,auVar115,1);
      auVar100 = vxorps_avx512vl(auVar100,auVar116);
      auVar102 = vrcp14ps_avx512vl(auVar101);
      auVar93 = vxorps_avx512vl(auVar101,auVar116);
      auVar105 = vfnmadd213ps_avx512vl(auVar102,auVar101,auVar99);
      auVar86 = vfmadd132ps_fma(auVar105,auVar102,auVar102);
      auVar249 = ZEXT1664(auVar86);
      fVar143 = auVar86._0_4_ * auVar100._0_4_;
      fVar230 = auVar86._4_4_ * auVar100._4_4_;
      auVar51._4_4_ = fVar230;
      auVar51._0_4_ = fVar143;
      fVar231 = auVar86._8_4_ * auVar100._8_4_;
      auVar51._8_4_ = fVar231;
      fVar232 = auVar86._12_4_ * auVar100._12_4_;
      auVar51._12_4_ = fVar232;
      fVar239 = auVar100._16_4_ * 0.0;
      auVar51._16_4_ = fVar239;
      fVar240 = auVar100._20_4_ * 0.0;
      auVar51._20_4_ = fVar240;
      fVar241 = auVar100._24_4_ * 0.0;
      auVar51._24_4_ = fVar241;
      auVar51._28_4_ = auVar100._28_4_;
      uVar19 = vcmpps_avx512vl(auVar101,auVar93,1);
      bVar77 = (byte)uVar18 | (byte)uVar19;
      auVar105 = vblendmps_avx512vl(auVar51,auVar121);
      auVar125._0_4_ =
           (uint)(bVar77 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar102._0_4_;
      bVar11 = (bool)(bVar77 >> 1 & 1);
      auVar125._4_4_ = (uint)bVar11 * auVar105._4_4_ | (uint)!bVar11 * auVar102._4_4_;
      bVar11 = (bool)(bVar77 >> 2 & 1);
      auVar125._8_4_ = (uint)bVar11 * auVar105._8_4_ | (uint)!bVar11 * auVar102._8_4_;
      bVar11 = (bool)(bVar77 >> 3 & 1);
      auVar125._12_4_ = (uint)bVar11 * auVar105._12_4_ | (uint)!bVar11 * auVar102._12_4_;
      bVar11 = (bool)(bVar77 >> 4 & 1);
      auVar125._16_4_ = (uint)bVar11 * auVar105._16_4_ | (uint)!bVar11 * auVar102._16_4_;
      bVar11 = (bool)(bVar77 >> 5 & 1);
      auVar125._20_4_ = (uint)bVar11 * auVar105._20_4_ | (uint)!bVar11 * auVar102._20_4_;
      bVar11 = (bool)(bVar77 >> 6 & 1);
      auVar125._24_4_ = (uint)bVar11 * auVar105._24_4_ | (uint)!bVar11 * auVar102._24_4_;
      auVar125._28_4_ =
           (uint)(bVar77 >> 7) * auVar105._28_4_ | (uint)!(bool)(bVar77 >> 7) * auVar102._28_4_;
      auVar244 = ZEXT3264(auVar125);
      _local_6a0 = vmaxps_avx(auVar94,auVar125);
      uVar19 = vcmpps_avx512vl(auVar101,auVar93,6);
      bVar77 = (byte)uVar18 | (byte)uVar19;
      auVar126._0_4_ = (uint)(bVar77 & 1) * 0x7f800000 | (uint)!(bool)(bVar77 & 1) * (int)fVar143;
      bVar11 = (bool)(bVar77 >> 1 & 1);
      auVar126._4_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar230;
      bVar11 = (bool)(bVar77 >> 2 & 1);
      auVar126._8_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar231;
      bVar11 = (bool)(bVar77 >> 3 & 1);
      auVar126._12_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar232;
      bVar11 = (bool)(bVar77 >> 4 & 1);
      auVar126._16_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar239;
      bVar11 = (bool)(bVar77 >> 5 & 1);
      auVar126._20_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar240;
      bVar11 = (bool)(bVar77 >> 6 & 1);
      auVar126._24_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar241;
      auVar126._28_4_ =
           (uint)(bVar77 >> 7) * 0x7f800000 | (uint)!(bool)(bVar77 >> 7) * auVar100._28_4_;
      auVar238 = ZEXT3264(auVar126);
      local_460 = vminps_avx(auVar92,auVar126);
      auVar237 = ZEXT3264(local_460);
      uVar18 = vcmpps_avx512vl(_local_6a0,local_460,2);
      bVar73 = bVar73 & 0x7f & (byte)uVar18;
      if (bVar73 != 0) {
        auVar100 = vmaxps_avx512vl(auVar106,auVar103);
        auVar94 = vminps_avx512vl(local_500,auVar99);
        auVar57 = ZEXT412(0);
        auVar244 = ZEXT1264(auVar57) << 0x20;
        auVar94 = vmaxps_avx(auVar94,ZEXT1232(auVar57) << 0x20);
        auVar101 = vminps_avx512vl(local_520,auVar99);
        auVar249 = ZEXT3264(CONCAT428(0x3e000000,
                                      CONCAT424(0x3e000000,
                                                CONCAT420(0x3e000000,
                                                          CONCAT416(0x3e000000,
                                                                    CONCAT412(0x3e000000,
                                                                              CONCAT48(0x3e000000,
                                                                                                                                                                              
                                                  0x3e0000003e000000)))))));
        auVar52._4_4_ = (auVar94._4_4_ + 1.0) * 0.125;
        auVar52._0_4_ = (auVar94._0_4_ + 0.0) * 0.125;
        auVar52._8_4_ = (auVar94._8_4_ + 2.0) * 0.125;
        auVar52._12_4_ = (auVar94._12_4_ + 3.0) * 0.125;
        auVar52._16_4_ = (auVar94._16_4_ + 4.0) * 0.125;
        auVar52._20_4_ = (auVar94._20_4_ + 5.0) * 0.125;
        auVar52._24_4_ = (auVar94._24_4_ + 6.0) * 0.125;
        auVar52._28_4_ = auVar94._28_4_ + 7.0;
        auVar86 = vfmadd213ps_fma(auVar52,local_7e0,auVar220);
        local_500 = ZEXT1632(auVar86);
        auVar94 = vmaxps_avx(auVar101,ZEXT1232(auVar57) << 0x20);
        auVar53._4_4_ = (auVar94._4_4_ + 1.0) * 0.125;
        auVar53._0_4_ = (auVar94._0_4_ + 0.0) * 0.125;
        auVar53._8_4_ = (auVar94._8_4_ + 2.0) * 0.125;
        auVar53._12_4_ = (auVar94._12_4_ + 3.0) * 0.125;
        auVar53._16_4_ = (auVar94._16_4_ + 4.0) * 0.125;
        auVar53._20_4_ = (auVar94._20_4_ + 5.0) * 0.125;
        auVar53._24_4_ = (auVar94._24_4_ + 6.0) * 0.125;
        auVar53._28_4_ = auVar94._28_4_ + 7.0;
        auVar86 = vfmadd213ps_fma(auVar53,local_7e0,auVar220);
        local_520 = ZEXT1632(auVar86);
        auVar213._0_4_ = auVar100._0_4_ * auVar100._0_4_;
        auVar213._4_4_ = auVar100._4_4_ * auVar100._4_4_;
        auVar213._8_4_ = auVar100._8_4_ * auVar100._8_4_;
        auVar213._12_4_ = auVar100._12_4_ * auVar100._12_4_;
        auVar213._16_4_ = auVar100._16_4_ * auVar100._16_4_;
        auVar213._20_4_ = auVar100._20_4_ * auVar100._20_4_;
        auVar213._24_4_ = auVar100._24_4_ * auVar100._24_4_;
        auVar213._28_4_ = 0;
        auVar94 = vsubps_avx(auVar109,auVar213);
        auVar95 = vmulps_avx512vl(auVar95,auVar94);
        auVar95 = vsubps_avx512vl(auVar113,auVar95);
        uVar18 = vcmpps_avx512vl(auVar95,ZEXT1232(auVar57) << 0x20,5);
        bVar77 = (byte)uVar18;
        if (bVar77 == 0) {
          auVar97 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar98 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar99 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar95 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar238 = ZEXT864(0) << 0x20;
          auVar127._8_4_ = 0x7f800000;
          auVar127._0_8_ = 0x7f8000007f800000;
          auVar127._12_4_ = 0x7f800000;
          auVar127._16_4_ = 0x7f800000;
          auVar127._20_4_ = 0x7f800000;
          auVar127._24_4_ = 0x7f800000;
          auVar127._28_4_ = 0x7f800000;
          auVar128._8_4_ = 0xff800000;
          auVar128._0_8_ = 0xff800000ff800000;
          auVar128._12_4_ = 0xff800000;
          auVar128._16_4_ = 0xff800000;
          auVar128._20_4_ = 0xff800000;
          auVar128._24_4_ = 0xff800000;
          auVar128._28_4_ = 0xff800000;
        }
        else {
          auVar87 = vxorps_avx512vl(auVar104._0_16_,auVar104._0_16_);
          uVar82 = vcmpps_avx512vl(auVar95,auVar106,5);
          auVar95 = vsqrtps_avx(auVar95);
          auVar223._0_4_ = auVar96._0_4_ + auVar96._0_4_;
          auVar223._4_4_ = auVar96._4_4_ + auVar96._4_4_;
          auVar223._8_4_ = auVar96._8_4_ + auVar96._8_4_;
          auVar223._12_4_ = auVar96._12_4_ + auVar96._12_4_;
          auVar223._16_4_ = auVar96._16_4_ + auVar96._16_4_;
          auVar223._20_4_ = auVar96._20_4_ + auVar96._20_4_;
          auVar223._24_4_ = auVar96._24_4_ + auVar96._24_4_;
          auVar223._28_4_ = auVar96._28_4_ + auVar96._28_4_;
          auVar100 = vrcp14ps_avx512vl(auVar223);
          auVar99 = vfnmadd213ps_avx512vl(auVar223,auVar100,auVar99);
          auVar86 = vfmadd132ps_fma(auVar99,auVar100,auVar100);
          auVar27._8_4_ = 0x80000000;
          auVar27._0_8_ = 0x8000000080000000;
          auVar27._12_4_ = 0x80000000;
          auVar27._16_4_ = 0x80000000;
          auVar27._20_4_ = 0x80000000;
          auVar27._24_4_ = 0x80000000;
          auVar27._28_4_ = 0x80000000;
          auVar99 = vxorps_avx512vl(auVar108,auVar27);
          auVar99 = vsubps_avx(auVar99,auVar95);
          auVar54._4_4_ = auVar99._4_4_ * auVar86._4_4_;
          auVar54._0_4_ = auVar99._0_4_ * auVar86._0_4_;
          auVar54._8_4_ = auVar99._8_4_ * auVar86._8_4_;
          auVar54._12_4_ = auVar99._12_4_ * auVar86._12_4_;
          auVar54._16_4_ = auVar99._16_4_ * 0.0;
          auVar54._20_4_ = auVar99._20_4_ * 0.0;
          auVar54._24_4_ = auVar99._24_4_ * 0.0;
          auVar54._28_4_ = 0x3e000000;
          auVar95 = vsubps_avx512vl(auVar95,auVar108);
          auVar55._4_4_ = auVar95._4_4_ * auVar86._4_4_;
          auVar55._0_4_ = auVar95._0_4_ * auVar86._0_4_;
          auVar55._8_4_ = auVar95._8_4_ * auVar86._8_4_;
          auVar55._12_4_ = auVar95._12_4_ * auVar86._12_4_;
          auVar55._16_4_ = auVar95._16_4_ * 0.0;
          auVar55._20_4_ = auVar95._20_4_ * 0.0;
          auVar55._24_4_ = auVar95._24_4_ * 0.0;
          auVar55._28_4_ = 0x7f800000;
          auVar253 = ZEXT3264(auVar55);
          auVar95 = vfmadd213ps_avx512vl(auVar110,auVar54,auVar111);
          auVar56._4_4_ = auVar91._4_4_ * auVar95._4_4_;
          auVar56._0_4_ = auVar91._0_4_ * auVar95._0_4_;
          auVar56._8_4_ = auVar91._8_4_ * auVar95._8_4_;
          auVar56._12_4_ = auVar91._12_4_ * auVar95._12_4_;
          auVar56._16_4_ = auVar91._16_4_ * auVar95._16_4_;
          auVar56._20_4_ = auVar91._20_4_ * auVar95._20_4_;
          auVar56._24_4_ = auVar91._24_4_ * auVar95._24_4_;
          auVar56._28_4_ = auVar99._28_4_;
          auVar99 = vmulps_avx512vl(local_4a0,auVar54);
          auVar95 = vmulps_avx512vl(local_820,auVar54);
          auVar100 = vmulps_avx512vl(local_840,auVar54);
          auVar101 = vfmadd213ps_avx512vl(auVar97,auVar56,local_8a0);
          auVar99 = vsubps_avx512vl(auVar99,auVar101);
          auVar101 = vfmadd213ps_avx512vl(auVar98,auVar56,auVar199);
          auVar95 = vsubps_avx512vl(auVar95,auVar101);
          auVar86 = vfmadd213ps_fma(auVar56,local_660,local_800);
          auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar86));
          auVar238 = ZEXT3264(auVar100);
          auVar100 = vfmadd213ps_avx512vl(auVar110,auVar55,auVar111);
          auVar100 = vmulps_avx512vl(auVar91,auVar100);
          auVar101 = vmulps_avx512vl(local_4a0,auVar55);
          auVar102 = vmulps_avx512vl(local_820,auVar55);
          auVar103 = vmulps_avx512vl(local_840,auVar55);
          auVar86 = vfmadd213ps_fma(auVar97,auVar100,local_8a0);
          auVar97 = vsubps_avx(auVar101,ZEXT1632(auVar86));
          auVar244 = ZEXT3264(auVar97);
          auVar86 = vfmadd213ps_fma(auVar98,auVar100,auVar199);
          auVar97 = vsubps_avx512vl(auVar102,ZEXT1632(auVar86));
          auVar86 = vfmadd213ps_fma(local_660,auVar100,local_800);
          auVar98 = vsubps_avx512vl(auVar103,ZEXT1632(auVar86));
          auVar154._8_4_ = 0x7f800000;
          auVar154._0_8_ = 0x7f8000007f800000;
          auVar154._12_4_ = 0x7f800000;
          auVar154._16_4_ = 0x7f800000;
          auVar154._20_4_ = 0x7f800000;
          auVar154._24_4_ = 0x7f800000;
          auVar154._28_4_ = 0x7f800000;
          auVar100 = vblendmps_avx512vl(auVar154,auVar54);
          bVar11 = (bool)((byte)uVar82 & 1);
          auVar127._0_4_ = (uint)bVar11 * auVar100._0_4_ | (uint)!bVar11 * auVar243._0_4_;
          bVar11 = (bool)((byte)(uVar82 >> 1) & 1);
          auVar127._4_4_ = (uint)bVar11 * auVar100._4_4_ | (uint)!bVar11 * auVar243._4_4_;
          bVar11 = (bool)((byte)(uVar82 >> 2) & 1);
          auVar127._8_4_ = (uint)bVar11 * auVar100._8_4_ | (uint)!bVar11 * auVar243._8_4_;
          bVar11 = (bool)((byte)(uVar82 >> 3) & 1);
          auVar127._12_4_ = (uint)bVar11 * auVar100._12_4_ | (uint)!bVar11 * auVar243._12_4_;
          iVar1 = (uint)((byte)(uVar82 >> 4) & 1) * auVar100._16_4_;
          auVar127._16_4_ = iVar1;
          iVar2 = (uint)((byte)(uVar82 >> 5) & 1) * auVar100._20_4_;
          auVar127._20_4_ = iVar2;
          iVar3 = (uint)((byte)(uVar82 >> 6) & 1) * auVar100._24_4_;
          auVar127._24_4_ = iVar3;
          iVar4 = (uint)(byte)(uVar82 >> 7) * auVar100._28_4_;
          auVar127._28_4_ = iVar4;
          auVar155._8_4_ = 0xff800000;
          auVar155._0_8_ = 0xff800000ff800000;
          auVar155._12_4_ = 0xff800000;
          auVar155._16_4_ = 0xff800000;
          auVar155._20_4_ = 0xff800000;
          auVar155._24_4_ = 0xff800000;
          auVar155._28_4_ = 0xff800000;
          auVar100 = vblendmps_avx512vl(auVar155,auVar55);
          bVar11 = (bool)((byte)uVar82 & 1);
          auVar128._0_4_ = (uint)bVar11 * auVar100._0_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = (bool)((byte)(uVar82 >> 1) & 1);
          auVar128._4_4_ = (uint)bVar11 * auVar100._4_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = (bool)((byte)(uVar82 >> 2) & 1);
          auVar128._8_4_ = (uint)bVar11 * auVar100._8_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = (bool)((byte)(uVar82 >> 3) & 1);
          auVar128._12_4_ = (uint)bVar11 * auVar100._12_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = (bool)((byte)(uVar82 >> 4) & 1);
          auVar128._16_4_ = (uint)bVar11 * auVar100._16_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = (bool)((byte)(uVar82 >> 5) & 1);
          auVar128._20_4_ = (uint)bVar11 * auVar100._20_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = (bool)((byte)(uVar82 >> 6) & 1);
          auVar128._24_4_ = (uint)bVar11 * auVar100._24_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = SUB81(uVar82 >> 7,0);
          auVar128._28_4_ = (uint)bVar11 * auVar100._28_4_ | (uint)!bVar11 * -0x800000;
          auVar234._8_4_ = 0x7fffffff;
          auVar234._0_8_ = 0x7fffffff7fffffff;
          auVar234._12_4_ = 0x7fffffff;
          auVar234._16_4_ = 0x7fffffff;
          auVar234._20_4_ = 0x7fffffff;
          auVar234._24_4_ = 0x7fffffff;
          auVar234._28_4_ = 0x7fffffff;
          vandps_avx512vl(auVar112,auVar234);
          auVar249 = ZEXT3264(local_4c0);
          auVar100 = vmaxps_avx(local_4c0,auVar128);
          auVar28._8_4_ = 0x36000000;
          auVar28._0_8_ = 0x3600000036000000;
          auVar28._12_4_ = 0x36000000;
          auVar28._16_4_ = 0x36000000;
          auVar28._20_4_ = 0x36000000;
          auVar28._24_4_ = 0x36000000;
          auVar28._28_4_ = 0x36000000;
          auVar100 = vmulps_avx512vl(auVar100,auVar28);
          auVar96 = vandps_avx(auVar96,auVar234);
          uVar78 = vcmpps_avx512vl(auVar96,auVar100,1);
          uVar82 = uVar82 & uVar78;
          bVar75 = (byte)uVar82;
          if (bVar75 != 0) {
            uVar78 = vcmpps_avx512vl(auVar94,ZEXT1632(auVar87),2);
            auVar235._8_4_ = 0xff800000;
            auVar235._0_8_ = 0xff800000ff800000;
            auVar235._12_4_ = 0xff800000;
            auVar235._16_4_ = 0xff800000;
            auVar235._20_4_ = 0xff800000;
            auVar235._24_4_ = 0xff800000;
            auVar235._28_4_ = 0xff800000;
            auVar246._8_4_ = 0x7f800000;
            auVar246._0_8_ = 0x7f8000007f800000;
            auVar246._12_4_ = 0x7f800000;
            auVar246._16_4_ = 0x7f800000;
            auVar246._20_4_ = 0x7f800000;
            auVar246._24_4_ = 0x7f800000;
            auVar246._28_4_ = 0x7f800000;
            auVar96 = vblendmps_avx512vl(auVar246,auVar235);
            bVar74 = (byte)uVar78;
            uVar83 = (uint)(bVar74 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar100._0_4_
            ;
            bVar11 = (bool)((byte)(uVar78 >> 1) & 1);
            uVar136 = (uint)bVar11 * auVar96._4_4_ | (uint)!bVar11 * auVar100._4_4_;
            bVar11 = (bool)((byte)(uVar78 >> 2) & 1);
            uVar137 = (uint)bVar11 * auVar96._8_4_ | (uint)!bVar11 * auVar100._8_4_;
            bVar11 = (bool)((byte)(uVar78 >> 3) & 1);
            uVar138 = (uint)bVar11 * auVar96._12_4_ | (uint)!bVar11 * auVar100._12_4_;
            bVar11 = (bool)((byte)(uVar78 >> 4) & 1);
            uVar139 = (uint)bVar11 * auVar96._16_4_ | (uint)!bVar11 * auVar100._16_4_;
            bVar11 = (bool)((byte)(uVar78 >> 5) & 1);
            uVar140 = (uint)bVar11 * auVar96._20_4_ | (uint)!bVar11 * auVar100._20_4_;
            bVar11 = (bool)((byte)(uVar78 >> 6) & 1);
            uVar141 = (uint)bVar11 * auVar96._24_4_ | (uint)!bVar11 * auVar100._24_4_;
            bVar11 = SUB81(uVar78 >> 7,0);
            uVar142 = (uint)bVar11 * auVar96._28_4_ | (uint)!bVar11 * auVar100._28_4_;
            auVar127._0_4_ = (bVar75 & 1) * uVar83 | !(bool)(bVar75 & 1) * auVar127._0_4_;
            bVar11 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar127._4_4_ = bVar11 * uVar136 | !bVar11 * auVar127._4_4_;
            bVar11 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar127._8_4_ = bVar11 * uVar137 | !bVar11 * auVar127._8_4_;
            bVar11 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar127._12_4_ = bVar11 * uVar138 | !bVar11 * auVar127._12_4_;
            bVar11 = (bool)((byte)(uVar82 >> 4) & 1);
            auVar127._16_4_ = bVar11 * uVar139 | (uint)!bVar11 * iVar1;
            bVar11 = (bool)((byte)(uVar82 >> 5) & 1);
            auVar127._20_4_ = bVar11 * uVar140 | (uint)!bVar11 * iVar2;
            bVar11 = (bool)((byte)(uVar82 >> 6) & 1);
            auVar127._24_4_ = bVar11 * uVar141 | (uint)!bVar11 * iVar3;
            bVar11 = SUB81(uVar82 >> 7,0);
            auVar127._28_4_ = bVar11 * uVar142 | (uint)!bVar11 * iVar4;
            auVar96 = vblendmps_avx512vl(auVar235,auVar246);
            bVar11 = (bool)((byte)(uVar78 >> 1) & 1);
            bVar12 = (bool)((byte)(uVar78 >> 2) & 1);
            bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar78 >> 4) & 1);
            bVar15 = (bool)((byte)(uVar78 >> 5) & 1);
            bVar16 = (bool)((byte)(uVar78 >> 6) & 1);
            bVar17 = SUB81(uVar78 >> 7,0);
            auVar128._0_4_ =
                 (uint)(bVar75 & 1) *
                 ((uint)(bVar74 & 1) * auVar96._0_4_ | !(bool)(bVar74 & 1) * uVar83) |
                 !(bool)(bVar75 & 1) * auVar128._0_4_;
            bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar128._4_4_ =
                 (uint)bVar81 * ((uint)bVar11 * auVar96._4_4_ | !bVar11 * uVar136) |
                 !bVar81 * auVar128._4_4_;
            bVar11 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar128._8_4_ =
                 (uint)bVar11 * ((uint)bVar12 * auVar96._8_4_ | !bVar12 * uVar137) |
                 !bVar11 * auVar128._8_4_;
            bVar11 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar128._12_4_ =
                 (uint)bVar11 * ((uint)bVar13 * auVar96._12_4_ | !bVar13 * uVar138) |
                 !bVar11 * auVar128._12_4_;
            bVar11 = (bool)((byte)(uVar82 >> 4) & 1);
            auVar128._16_4_ =
                 (uint)bVar11 * ((uint)bVar14 * auVar96._16_4_ | !bVar14 * uVar139) |
                 !bVar11 * auVar128._16_4_;
            bVar11 = (bool)((byte)(uVar82 >> 5) & 1);
            auVar128._20_4_ =
                 (uint)bVar11 * ((uint)bVar15 * auVar96._20_4_ | !bVar15 * uVar140) |
                 !bVar11 * auVar128._20_4_;
            bVar11 = (bool)((byte)(uVar82 >> 6) & 1);
            auVar128._24_4_ =
                 (uint)bVar11 * ((uint)bVar16 * auVar96._24_4_ | !bVar16 * uVar141) |
                 !bVar11 * auVar128._24_4_;
            bVar11 = SUB81(uVar82 >> 7,0);
            auVar128._28_4_ =
                 (uint)bVar11 * ((uint)bVar17 * auVar96._28_4_ | !bVar17 * uVar142) |
                 !bVar11 * auVar128._28_4_;
            bVar77 = (~bVar75 | bVar74) & bVar77;
          }
        }
        auVar245._8_4_ = 0x7fffffff;
        auVar245._0_8_ = 0x7fffffff7fffffff;
        auVar245._12_4_ = 0x7fffffff;
        auVar96 = vmulps_avx512vl(local_840,auVar98);
        auVar96 = vfmadd231ps_avx512vl(auVar96,local_820,auVar97);
        auVar96 = vfmadd231ps_avx512vl(auVar96,local_4a0,auVar244._0_32_);
        _local_1c0 = _local_6a0;
        local_1a0 = vminps_avx(local_460,auVar127);
        auVar229._8_4_ = 0x7fffffff;
        auVar229._0_8_ = 0x7fffffff7fffffff;
        auVar229._12_4_ = 0x7fffffff;
        auVar229._16_4_ = 0x7fffffff;
        auVar229._20_4_ = 0x7fffffff;
        auVar229._24_4_ = 0x7fffffff;
        auVar229._28_4_ = 0x7fffffff;
        auVar96 = vandps_avx(auVar96,auVar229);
        _local_480 = vmaxps_avx(_local_6a0,auVar128);
        auVar226 = ZEXT3264(_local_480);
        auVar156._8_4_ = 0x3e99999a;
        auVar156._0_8_ = 0x3e99999a3e99999a;
        auVar156._12_4_ = 0x3e99999a;
        auVar156._16_4_ = 0x3e99999a;
        auVar156._20_4_ = 0x3e99999a;
        auVar156._24_4_ = 0x3e99999a;
        auVar156._28_4_ = 0x3e99999a;
        uVar18 = vcmpps_avx512vl(auVar96,auVar156,1);
        local_8dc = (undefined4)uVar18;
        uVar18 = vcmpps_avx512vl(_local_6a0,local_1a0,2);
        bVar75 = (byte)uVar18 & bVar73;
        _local_560 = _local_480;
        uVar19 = vcmpps_avx512vl(_local_480,local_460,2);
        if ((bVar73 & ((byte)uVar19 | (byte)uVar18)) == 0) {
          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar254 = ZEXT3264(auVar96);
        }
        else {
          auVar96 = vmulps_avx512vl(local_840,auVar238._0_32_);
          auVar96 = vfmadd213ps_avx512vl(auVar95,local_820,auVar96);
          auVar96 = vfmadd213ps_avx512vl(auVar99,local_4a0,auVar96);
          auVar96 = vandps_avx(auVar96,auVar229);
          uVar18 = vcmpps_avx512vl(auVar96,auVar156,1);
          local_8e4 = (uint)(byte)~bVar77;
          bVar77 = (byte)uVar18 | ~bVar77;
          auVar157._8_4_ = 2;
          auVar157._0_8_ = 0x200000002;
          auVar157._12_4_ = 2;
          auVar157._16_4_ = 2;
          auVar157._20_4_ = 2;
          auVar157._24_4_ = 2;
          auVar157._28_4_ = 2;
          auVar29._8_4_ = 3;
          auVar29._0_8_ = 0x300000003;
          auVar29._12_4_ = 3;
          auVar29._16_4_ = 3;
          auVar29._20_4_ = 3;
          auVar29._24_4_ = 3;
          auVar29._28_4_ = 3;
          auVar96 = vpblendmd_avx512vl(auVar157,auVar29);
          local_440._0_4_ = (uint)(bVar77 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar77 & 1) * 2;
          bVar11 = (bool)(bVar77 >> 1 & 1);
          local_440._4_4_ = (uint)bVar11 * auVar96._4_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar77 >> 2 & 1);
          local_440._8_4_ = (uint)bVar11 * auVar96._8_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar77 >> 3 & 1);
          local_440._12_4_ = (uint)bVar11 * auVar96._12_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar77 >> 4 & 1);
          local_440._16_4_ = (uint)bVar11 * auVar96._16_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar77 >> 5 & 1);
          local_440._20_4_ = (uint)bVar11 * auVar96._20_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar77 >> 6 & 1);
          local_440._24_4_ = (uint)bVar11 * auVar96._24_4_ | (uint)!bVar11 * 2;
          local_440._28_4_ = (uint)(bVar77 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar77 >> 7) * 2;
          local_4e0 = vpbroadcastd_avx512vl();
          uVar18 = vpcmpd_avx512vl(local_4e0,local_440,5);
          local_8e0 = (uint)bVar75;
          bVar75 = (byte)uVar18 & bVar75;
          if (bVar75 != 0) {
            auVar243 = vminps_avx(local_740._0_16_,local_780._0_16_);
            auVar86 = vmaxps_avx(local_740._0_16_,local_780._0_16_);
            auVar87 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar5 = vminps_avx(auVar243,auVar87);
            auVar243 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar87 = vmaxps_avx(auVar86,auVar243);
            auVar86 = vandps_avx(auVar245,auVar5);
            auVar243 = vandps_avx(auVar245,auVar87);
            auVar86 = vmaxps_avx(auVar86,auVar243);
            auVar243 = vmovshdup_avx(auVar86);
            auVar243 = vmaxss_avx(auVar243,auVar86);
            auVar86 = vshufpd_avx(auVar86,auVar86,1);
            auVar86 = vmaxss_avx(auVar86,auVar243);
            fVar143 = auVar86._0_4_ * 1.9073486e-06;
            local_710 = vshufps_avx(auVar87,auVar87,0xff);
            local_540 = (float)local_6a0._0_4_ + (float)local_680._0_4_;
            fStack_53c = (float)local_6a0._4_4_ + (float)local_680._4_4_;
            fStack_538 = fStack_698 + fStack_678;
            fStack_534 = fStack_694 + fStack_674;
            fStack_530 = fStack_690 + fStack_670;
            fStack_52c = fStack_68c + fStack_66c;
            fStack_528 = fStack_688 + fStack_668;
            fStack_524 = fStack_684 + fStack_664;
            do {
              auVar158._8_4_ = 0x7f800000;
              auVar158._0_8_ = 0x7f8000007f800000;
              auVar158._12_4_ = 0x7f800000;
              auVar158._16_4_ = 0x7f800000;
              auVar158._20_4_ = 0x7f800000;
              auVar158._24_4_ = 0x7f800000;
              auVar158._28_4_ = 0x7f800000;
              auVar96 = vblendmps_avx512vl(auVar158,_local_6a0);
              auVar129._0_4_ =
                   (uint)(bVar75 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar75 & 1) * 0x7f800000;
              bVar11 = (bool)(bVar75 >> 1 & 1);
              auVar129._4_4_ = (uint)bVar11 * auVar96._4_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar75 >> 2 & 1);
              auVar129._8_4_ = (uint)bVar11 * auVar96._8_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar75 >> 3 & 1);
              auVar129._12_4_ = (uint)bVar11 * auVar96._12_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar75 >> 4 & 1);
              auVar129._16_4_ = (uint)bVar11 * auVar96._16_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar75 >> 5 & 1);
              auVar129._20_4_ = (uint)bVar11 * auVar96._20_4_ | (uint)!bVar11 * 0x7f800000;
              auVar129._24_4_ =
                   (uint)(bVar75 >> 6) * auVar96._24_4_ | (uint)!(bool)(bVar75 >> 6) * 0x7f800000;
              auVar129._28_4_ = 0x7f800000;
              auVar96 = vshufps_avx(auVar129,auVar129,0xb1);
              auVar96 = vminps_avx(auVar129,auVar96);
              auVar94 = vshufpd_avx(auVar96,auVar96,5);
              auVar96 = vminps_avx(auVar96,auVar94);
              auVar94 = vpermpd_avx2(auVar96,0x4e);
              auVar96 = vminps_avx(auVar96,auVar94);
              uVar18 = vcmpps_avx512vl(auVar129,auVar96,0);
              bVar74 = (byte)uVar18 & bVar75;
              bVar77 = bVar75;
              if (bVar74 != 0) {
                bVar77 = bVar74;
              }
              iVar2 = 0;
              for (uVar83 = (uint)bVar77; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
                iVar2 = iVar2 + 1;
              }
              uVar83 = *(uint *)(local_500 + (uint)(iVar2 << 2));
              uVar136 = *(uint *)(local_1c0 + (uint)(iVar2 << 2));
              fVar230 = local_8d8;
              if ((float)local_7c0._0_4_ < 0.0) {
                fVar230 = sqrtf((float)local_7c0._0_4_);
              }
              auVar244 = ZEXT464(uVar83);
              auVar237 = ZEXT464(uVar136);
              lVar80 = 4;
              do {
                fVar231 = auVar237._0_4_;
                auVar146._4_4_ = fVar231;
                auVar146._0_4_ = fVar231;
                auVar146._8_4_ = fVar231;
                auVar146._12_4_ = fVar231;
                auVar86 = vfmadd132ps_fma(auVar146,ZEXT816(0) << 0x40,local_7b0);
                fVar242 = auVar244._0_4_;
                fVar225 = 1.0 - fVar242;
                fVar240 = fVar225 * fVar225 * fVar225;
                fVar232 = fVar242 * fVar242;
                fVar233 = fVar242 * fVar232;
                auVar243 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar240),
                                           ZEXT416((uint)fVar233));
                fVar239 = fVar242 * fVar225;
                auVar215 = ZEXT416((uint)fVar225);
                auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * fVar239 * 6.0)),
                                         ZEXT416((uint)(fVar239 * fVar225)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar233),
                                          ZEXT416((uint)fVar240));
                auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar239 * fVar225 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar242 * fVar239)));
                fVar240 = fVar240 * 0.16666667;
                fVar241 = (auVar243._0_4_ + auVar5._0_4_) * 0.16666667;
                fVar205 = (auVar87._0_4_ + auVar84._0_4_) * 0.16666667;
                fVar233 = fVar233 * 0.16666667;
                auVar189._0_4_ = fVar233 * (float)local_7a0._0_4_;
                auVar189._4_4_ = fVar233 * (float)local_7a0._4_4_;
                auVar189._8_4_ = fVar233 * fStack_798;
                auVar189._12_4_ = fVar233 * fStack_794;
                auVar216._4_4_ = fVar205;
                auVar216._0_4_ = fVar205;
                auVar216._8_4_ = fVar205;
                auVar216._12_4_ = fVar205;
                auVar243 = vfmadd132ps_fma(auVar216,auVar189,local_760._0_16_);
                auVar190._4_4_ = fVar241;
                auVar190._0_4_ = fVar241;
                auVar190._8_4_ = fVar241;
                auVar190._12_4_ = fVar241;
                auVar243 = vfmadd132ps_fma(auVar190,auVar243,local_780._0_16_);
                auVar169._4_4_ = fVar240;
                auVar169._0_4_ = fVar240;
                auVar169._8_4_ = fVar240;
                auVar169._12_4_ = fVar240;
                auVar243 = vfmadd132ps_fma(auVar169,auVar243,local_740._0_16_);
                local_660._0_16_ = auVar243;
                auVar86 = vsubps_avx(auVar86,auVar243);
                local_7e0._0_16_ = auVar86;
                auVar86 = vdpps_avx(auVar86,auVar86,0x7f);
                auVar243 = auVar244._0_16_;
                local_800._0_16_ = auVar86;
                if (auVar86._0_4_ < 0.0) {
                  local_8a0._0_4_ = fVar232;
                  auVar249._0_4_ = sqrtf(auVar86._0_4_);
                  auVar249._4_60_ = extraout_var;
                  auVar86 = auVar249._0_16_;
                }
                else {
                  auVar86 = vsqrtss_avx(auVar86,auVar86);
                  local_8a0._0_4_ = fVar232;
                }
                auVar5 = vfnmsub213ss_fma(auVar243,auVar243,ZEXT416((uint)(fVar239 * 4.0)));
                auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar239 * 4.0)),auVar215,auVar215);
                fVar232 = fVar225 * -fVar225 * 0.5;
                fVar239 = auVar5._0_4_ * 0.5;
                fVar240 = auVar87._0_4_ * 0.5;
                local_8a0._0_4_ = (float)local_8a0._0_4_ * 0.5;
                auVar207._0_4_ = (float)local_8a0._0_4_ * (float)local_7a0._0_4_;
                auVar207._4_4_ = (float)local_8a0._0_4_ * (float)local_7a0._4_4_;
                auVar207._8_4_ = (float)local_8a0._0_4_ * fStack_798;
                auVar207._12_4_ = (float)local_8a0._0_4_ * fStack_794;
                auVar170._4_4_ = fVar240;
                auVar170._0_4_ = fVar240;
                auVar170._8_4_ = fVar240;
                auVar170._12_4_ = fVar240;
                auVar87 = vfmadd132ps_fma(auVar170,auVar207,local_760._0_16_);
                auVar191._4_4_ = fVar239;
                auVar191._0_4_ = fVar239;
                auVar191._8_4_ = fVar239;
                auVar191._12_4_ = fVar239;
                auVar87 = vfmadd132ps_fma(auVar191,auVar87,local_780._0_16_);
                auVar250._4_4_ = fVar232;
                auVar250._0_4_ = fVar232;
                auVar250._8_4_ = fVar232;
                auVar250._12_4_ = fVar232;
                local_8a0._0_16_ = vfmadd132ps_fma(auVar250,auVar87,local_740._0_16_);
                local_6c0 = vdpps_avx(local_8a0._0_16_,local_8a0._0_16_,0x7f);
                auVar58._12_4_ = 0;
                auVar58._0_12_ = ZEXT812(0);
                fVar232 = local_6c0._0_4_;
                auVar87 = vrsqrt14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)fVar232));
                fVar239 = auVar87._0_4_;
                local_6d0 = vrcp14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)fVar232));
                auVar87 = vfnmadd213ss_fma(local_6d0,local_6c0,ZEXT416(0x40000000));
                uVar83 = auVar86._0_4_;
                local_6b0 = fVar225;
                fStack_6ac = fVar225;
                fStack_6a8 = fVar225;
                fStack_6a4 = fVar225;
                if (fVar232 < -fVar232) {
                  auVar253._0_4_ = sqrtf(fVar232);
                  auVar253._4_60_ = extraout_var_00;
                  auVar86 = ZEXT416(uVar83);
                  auVar84 = auVar253._0_16_;
                  auVar5 = local_8a0._0_16_;
                }
                else {
                  auVar84 = vsqrtss_avx512f(local_6c0,local_6c0);
                  auVar5 = local_8a0._0_16_;
                }
                fVar232 = fVar239 * 1.5 + fVar232 * -0.5 * fVar239 * fVar239 * fVar239;
                auVar147._0_4_ = auVar5._0_4_ * fVar232;
                auVar147._4_4_ = auVar5._4_4_ * fVar232;
                auVar147._8_4_ = auVar5._8_4_ * fVar232;
                auVar147._12_4_ = auVar5._12_4_ * fVar232;
                auVar6 = vdpps_avx(local_7e0._0_16_,auVar147,0x7f);
                fVar241 = auVar86._0_4_;
                fVar239 = auVar6._0_4_;
                auVar148._0_4_ = fVar239 * fVar239;
                auVar148._4_4_ = auVar6._4_4_ * auVar6._4_4_;
                auVar148._8_4_ = auVar6._8_4_ * auVar6._8_4_;
                auVar148._12_4_ = auVar6._12_4_ * auVar6._12_4_;
                auVar88 = vsubps_avx512vl(local_800._0_16_,auVar148);
                fVar240 = auVar88._0_4_;
                auVar171._4_12_ = ZEXT812(0) << 0x20;
                auVar171._0_4_ = fVar240;
                auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar171);
                auVar89 = vmulss_avx512f(auVar85,ZEXT416(0x3fc00000));
                auVar90 = vmulss_avx512f(auVar88,ZEXT416(0xbf000000));
                if (fVar240 < 0.0) {
                  local_6f0 = fVar232;
                  fStack_6ec = fVar232;
                  fStack_6e8 = fVar232;
                  fStack_6e4 = fVar232;
                  local_6e0 = auVar85;
                  fVar240 = sqrtf(fVar240);
                  auVar90 = ZEXT416(auVar90._0_4_);
                  auVar89 = ZEXT416(auVar89._0_4_);
                  auVar84 = ZEXT416(auVar84._0_4_);
                  auVar86 = ZEXT416(uVar83);
                  auVar5 = local_8a0._0_16_;
                  auVar85 = local_6e0;
                  fVar232 = local_6f0;
                  fVar205 = fStack_6ec;
                  fVar233 = fStack_6e8;
                  fVar225 = fStack_6e4;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar88,auVar88);
                  fVar240 = auVar88._0_4_;
                  fVar205 = fVar232;
                  fVar233 = fVar232;
                  fVar225 = fVar232;
                }
                auVar253 = ZEXT1664(auVar5);
                auVar238 = ZEXT1664(local_7e0._0_16_);
                auVar245._8_4_ = 0x7fffffff;
                auVar245._0_8_ = 0x7fffffff7fffffff;
                auVar245._12_4_ = 0x7fffffff;
                auVar256 = ZEXT3264(local_820);
                auVar255 = ZEXT3264(local_840);
                auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar215,auVar243);
                auVar243 = vfmadd231ss_fma(auVar215,auVar243,SUB6416(ZEXT464(0xc0000000),0));
                auVar192._0_4_ = fVar242 * (float)local_7a0._0_4_;
                auVar192._4_4_ = fVar242 * (float)local_7a0._4_4_;
                auVar192._8_4_ = fVar242 * fStack_798;
                auVar192._12_4_ = fVar242 * fStack_794;
                auVar208._0_4_ = auVar243._0_4_;
                auVar208._4_4_ = auVar208._0_4_;
                auVar208._8_4_ = auVar208._0_4_;
                auVar208._12_4_ = auVar208._0_4_;
                auVar243 = vfmadd132ps_fma(auVar208,auVar192,local_760._0_16_);
                auVar172._0_4_ = auVar88._0_4_;
                auVar172._4_4_ = auVar172._0_4_;
                auVar172._8_4_ = auVar172._0_4_;
                auVar172._12_4_ = auVar172._0_4_;
                auVar243 = vfmadd132ps_fma(auVar172,auVar243,local_780._0_16_);
                auVar64._4_4_ = fStack_6ac;
                auVar64._0_4_ = local_6b0;
                auVar64._8_4_ = fStack_6a8;
                auVar64._12_4_ = fStack_6a4;
                auVar243 = vfmadd132ps_fma(auVar64,auVar243,local_740._0_16_);
                auVar173._0_4_ = auVar243._0_4_ * (float)local_6c0._0_4_;
                auVar173._4_4_ = auVar243._4_4_ * (float)local_6c0._0_4_;
                auVar173._8_4_ = auVar243._8_4_ * (float)local_6c0._0_4_;
                auVar173._12_4_ = auVar243._12_4_ * (float)local_6c0._0_4_;
                auVar243 = vdpps_avx(auVar5,auVar243,0x7f);
                fVar188 = auVar243._0_4_;
                auVar193._0_4_ = auVar5._0_4_ * fVar188;
                auVar193._4_4_ = auVar5._4_4_ * fVar188;
                auVar193._8_4_ = auVar5._8_4_ * fVar188;
                auVar193._12_4_ = auVar5._12_4_ * fVar188;
                auVar243 = vsubps_avx(auVar173,auVar193);
                fVar188 = auVar87._0_4_ * (float)local_6d0._0_4_;
                auVar21._8_4_ = 0x80000000;
                auVar21._0_8_ = 0x8000000080000000;
                auVar21._12_4_ = 0x80000000;
                auVar131._16_16_ = local_840._16_16_;
                auVar88 = vxorps_avx512vl(auVar5,auVar21);
                auVar217._0_4_ = fVar232 * auVar243._0_4_ * fVar188;
                auVar217._4_4_ = fVar205 * auVar243._4_4_ * fVar188;
                auVar217._8_4_ = fVar233 * auVar243._8_4_ * fVar188;
                auVar217._12_4_ = fVar225 * auVar243._12_4_ * fVar188;
                auVar249 = ZEXT1664(auVar147);
                auVar243 = vdpps_avx(auVar88,auVar147,0x7f);
                auVar215 = vmaxss_avx(ZEXT416((uint)fVar143),
                                      ZEXT416((uint)(fVar231 * fVar230 * 1.9073486e-06)));
                auVar84 = vdivss_avx512f(ZEXT416((uint)fVar143),auVar84);
                auVar87 = vdpps_avx(local_7e0._0_16_,auVar217,0x7f);
                auVar86 = vfmadd213ss_fma(auVar86,ZEXT416((uint)fVar143),auVar215);
                auVar84 = vfmadd213ss_fma(ZEXT416((uint)(fVar241 + 1.0)),auVar84,auVar86);
                auVar86 = vdpps_avx(local_7b0,auVar147,0x7f);
                fVar232 = auVar243._0_4_ + auVar87._0_4_;
                auVar243 = vdpps_avx(local_7e0._0_16_,auVar88,0x7f);
                auVar88 = vmulss_avx512f(auVar90,auVar85);
                auVar85 = vmulss_avx512f(auVar85,auVar85);
                auVar87 = vdpps_avx(local_7e0._0_16_,local_7b0,0x7f);
                auVar89 = vaddss_avx512f(auVar89,ZEXT416((uint)(auVar88._0_4_ * auVar85._0_4_)));
                auVar85 = vfnmadd231ss_fma(auVar243,auVar6,ZEXT416((uint)fVar232));
                auVar88 = vfnmadd231ss_fma(auVar87,auVar6,auVar86);
                auVar243 = vpermilps_avx(local_660._0_16_,0xff);
                fVar240 = fVar240 - auVar243._0_4_;
                auVar243 = vshufps_avx(auVar5,auVar5,0xff);
                auVar87 = vfmsub213ss_fma(auVar85,auVar89,auVar243);
                fVar241 = auVar88._0_4_ * auVar89._0_4_;
                auVar85 = vfmsub231ss_fma(ZEXT416((uint)(auVar86._0_4_ * auVar87._0_4_)),
                                          ZEXT416((uint)fVar232),ZEXT416((uint)fVar241));
                fVar233 = auVar85._0_4_;
                fVar205 = fVar239 * (auVar87._0_4_ / fVar233);
                auVar226 = ZEXT464((uint)fVar205);
                fVar242 = fVar242 - (fVar239 * (fVar241 / fVar233) -
                                    fVar240 * (auVar86._0_4_ / fVar233));
                auVar244 = ZEXT464((uint)fVar242);
                fVar231 = fVar231 - (fVar240 * (fVar232 / fVar233) - fVar205);
                auVar237 = ZEXT464((uint)fVar231);
                auVar86 = vandps_avx(auVar6,auVar245);
                if (auVar84._0_4_ <= auVar86._0_4_) {
LAB_01e09884:
                  bVar11 = false;
                }
                else {
                  auVar87 = vfmadd231ss_fma(ZEXT416((uint)(auVar84._0_4_ + auVar215._0_4_)),
                                            local_710,ZEXT416(0x36000000));
                  auVar86 = vandps_avx(auVar245,ZEXT416((uint)fVar240));
                  if (auVar87._0_4_ <= auVar86._0_4_) goto LAB_01e09884;
                  fVar231 = fVar231 + (float)local_700._0_4_;
                  auVar237 = ZEXT464((uint)fVar231);
                  bVar11 = true;
                  if ((((fVar206 <= fVar231) &&
                       (fVar232 = *(float *)(ray + k * 4 + 0x80), fVar231 <= fVar232)) &&
                      (0.0 <= fVar242)) && (fVar242 <= 1.0)) {
                    auVar131._0_16_ = ZEXT816(0) << 0x20;
                    auVar130._4_28_ = auVar131._4_28_;
                    auVar130._0_4_ = local_800._0_4_;
                    auVar86 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar130._0_16_);
                    fVar239 = auVar86._0_4_;
                    auVar86 = vmulss_avx512f(local_800._0_16_,ZEXT416(0xbf000000));
                    pGVar9 = (context->scene->geometries).items[uVar79].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar239 = fVar239 * 1.5 + auVar86._0_4_ * fVar239 * fVar239 * fVar239;
                      auVar174._0_4_ = local_7e0._0_4_ * fVar239;
                      auVar174._4_4_ = local_7e0._4_4_ * fVar239;
                      auVar174._8_4_ = local_7e0._8_4_ * fVar239;
                      auVar174._12_4_ = local_7e0._12_4_ * fVar239;
                      auVar84 = vfmadd213ps_fma(auVar243,auVar174,auVar5);
                      auVar86 = vshufps_avx(auVar174,auVar174,0xc9);
                      auVar243 = vshufps_avx(auVar5,auVar5,0xc9);
                      auVar175._0_4_ = auVar174._0_4_ * auVar243._0_4_;
                      auVar175._4_4_ = auVar174._4_4_ * auVar243._4_4_;
                      auVar175._8_4_ = auVar174._8_4_ * auVar243._8_4_;
                      auVar175._12_4_ = auVar174._12_4_ * auVar243._12_4_;
                      auVar87 = vfmsub231ps_fma(auVar175,auVar5,auVar86);
                      auVar86 = vshufps_avx(auVar87,auVar87,0xc9);
                      auVar243 = vshufps_avx(auVar84,auVar84,0xc9);
                      auVar87 = vshufps_avx(auVar87,auVar87,0xd2);
                      auVar149._0_4_ = auVar84._0_4_ * auVar87._0_4_;
                      auVar149._4_4_ = auVar84._4_4_ * auVar87._4_4_;
                      auVar149._8_4_ = auVar84._8_4_ * auVar87._8_4_;
                      auVar149._12_4_ = auVar84._12_4_ * auVar87._12_4_;
                      auVar86 = vfmsub231ps_fma(auVar149,auVar86,auVar243);
                      uVar145 = auVar86._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar231;
                        uVar8 = vextractps_avx(auVar86,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                        uVar8 = vextractps_avx(auVar86,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar145;
                        *(float *)(ray + k * 4 + 0xf0) = fVar242;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_8f0;
                        *(uint *)(ray + k * 4 + 0x120) = uVar79;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_600 = (RTCHitN  [16])vshufps_avx(auVar86,auVar86,0x55);
                        auStack_5f0 = vshufps_avx(auVar86,auVar86,0xaa);
                        local_5e0 = uVar145;
                        uStack_5dc = uVar145;
                        uStack_5d8 = uVar145;
                        uStack_5d4 = uVar145;
                        local_5d0 = fVar242;
                        fStack_5cc = fVar242;
                        fStack_5c8 = fVar242;
                        fStack_5c4 = fVar242;
                        local_5c0 = ZEXT416(0) << 0x20;
                        local_5b0 = local_620._0_8_;
                        uStack_5a8 = local_620._8_8_;
                        local_5a0 = local_610;
                        vpcmpeqd_avx2(ZEXT1632(local_610),ZEXT1632(local_610));
                        uStack_58c = context->user->instID[0];
                        local_590 = uStack_58c;
                        uStack_588 = uStack_58c;
                        uStack_584 = uStack_58c;
                        uStack_580 = context->user->instPrimID[0];
                        uStack_57c = uStack_580;
                        uStack_578 = uStack_580;
                        uStack_574 = uStack_580;
                        *(float *)(ray + k * 4 + 0x80) = fVar231;
                        local_900 = local_630._0_8_;
                        uStack_8f8 = local_630._8_8_;
                        local_8d0.valid = (int *)&local_900;
                        local_8d0.geometryUserPtr = pGVar9->userPtr;
                        local_8d0.context = context->user;
                        local_8d0.hit = local_600;
                        local_8d0.N = 4;
                        local_8d0.ray = (RTCRayN *)ray;
                        if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar226 = ZEXT464((uint)fVar205);
                          auVar238 = ZEXT1664(local_7e0._0_16_);
                          auVar249 = ZEXT1664(auVar147);
                          auVar253 = ZEXT1664(auVar5);
                          (*pGVar9->intersectionFilterN)(&local_8d0);
                          auVar237 = ZEXT1664(ZEXT416((uint)fVar231));
                          auVar244 = ZEXT1664(ZEXT416((uint)fVar242));
                          auVar255 = ZEXT3264(local_840);
                          auVar256 = ZEXT3264(local_820);
                          auVar245._8_4_ = 0x7fffffff;
                          auVar245._0_8_ = 0x7fffffff7fffffff;
                          auVar245._12_4_ = 0x7fffffff;
                        }
                        auVar60._8_8_ = uStack_8f8;
                        auVar60._0_8_ = local_900;
                        uVar82 = vptestmd_avx512vl(auVar60,auVar60);
                        if ((uVar82 & 0xf) != 0) {
                          p_Var10 = context->args->filter;
                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar226 = ZEXT1664(auVar226._0_16_);
                            auVar238 = ZEXT1664(auVar238._0_16_);
                            auVar249 = ZEXT1664(auVar249._0_16_);
                            auVar253 = ZEXT1664(auVar253._0_16_);
                            (*p_Var10)(&local_8d0);
                            auVar237 = ZEXT1664(ZEXT416((uint)fVar231));
                            auVar244 = ZEXT1664(ZEXT416((uint)fVar242));
                            auVar255 = ZEXT3264(local_840);
                            auVar256 = ZEXT3264(local_820);
                            auVar245._8_4_ = 0x7fffffff;
                            auVar245._0_8_ = 0x7fffffff7fffffff;
                            auVar245._12_4_ = 0x7fffffff;
                          }
                          auVar61._8_8_ = uStack_8f8;
                          auVar61._0_8_ = local_900;
                          uVar82 = vptestmd_avx512vl(auVar61,auVar61);
                          uVar82 = uVar82 & 0xf;
                          bVar77 = (byte)uVar82;
                          if (bVar77 != 0) {
                            iVar3 = *(int *)(local_8d0.hit + 4);
                            iVar4 = *(int *)(local_8d0.hit + 8);
                            iVar1 = *(int *)(local_8d0.hit + 0xc);
                            bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar82 >> 2) & 1);
                            bVar13 = SUB81(uVar82 >> 3,0);
                            *(uint *)(local_8d0.ray + 0xc0) =
                                 (uint)(bVar77 & 1) * *(int *)local_8d0.hit |
                                 (uint)!(bool)(bVar77 & 1) * *(int *)(local_8d0.ray + 0xc0);
                            *(uint *)(local_8d0.ray + 0xc4) =
                                 (uint)bVar81 * iVar3 |
                                 (uint)!bVar81 * *(int *)(local_8d0.ray + 0xc4);
                            *(uint *)(local_8d0.ray + 200) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_8d0.ray + 200);
                            *(uint *)(local_8d0.ray + 0xcc) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_8d0.ray + 0xcc);
                            iVar3 = *(int *)(local_8d0.hit + 0x14);
                            iVar4 = *(int *)(local_8d0.hit + 0x18);
                            iVar1 = *(int *)(local_8d0.hit + 0x1c);
                            bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar82 >> 2) & 1);
                            bVar13 = SUB81(uVar82 >> 3,0);
                            *(uint *)(local_8d0.ray + 0xd0) =
                                 (uint)(bVar77 & 1) * *(int *)(local_8d0.hit + 0x10) |
                                 (uint)!(bool)(bVar77 & 1) * *(int *)(local_8d0.ray + 0xd0);
                            *(uint *)(local_8d0.ray + 0xd4) =
                                 (uint)bVar81 * iVar3 |
                                 (uint)!bVar81 * *(int *)(local_8d0.ray + 0xd4);
                            *(uint *)(local_8d0.ray + 0xd8) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_8d0.ray + 0xd8);
                            *(uint *)(local_8d0.ray + 0xdc) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_8d0.ray + 0xdc);
                            iVar3 = *(int *)(local_8d0.hit + 0x24);
                            iVar4 = *(int *)(local_8d0.hit + 0x28);
                            iVar1 = *(int *)(local_8d0.hit + 0x2c);
                            bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar82 >> 2) & 1);
                            bVar13 = SUB81(uVar82 >> 3,0);
                            *(uint *)(local_8d0.ray + 0xe0) =
                                 (uint)(bVar77 & 1) * *(int *)(local_8d0.hit + 0x20) |
                                 (uint)!(bool)(bVar77 & 1) * *(int *)(local_8d0.ray + 0xe0);
                            *(uint *)(local_8d0.ray + 0xe4) =
                                 (uint)bVar81 * iVar3 |
                                 (uint)!bVar81 * *(int *)(local_8d0.ray + 0xe4);
                            *(uint *)(local_8d0.ray + 0xe8) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_8d0.ray + 0xe8);
                            *(uint *)(local_8d0.ray + 0xec) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_8d0.ray + 0xec);
                            iVar3 = *(int *)(local_8d0.hit + 0x34);
                            iVar4 = *(int *)(local_8d0.hit + 0x38);
                            iVar1 = *(int *)(local_8d0.hit + 0x3c);
                            bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar82 >> 2) & 1);
                            bVar13 = SUB81(uVar82 >> 3,0);
                            *(uint *)(local_8d0.ray + 0xf0) =
                                 (uint)(bVar77 & 1) * *(int *)(local_8d0.hit + 0x30) |
                                 (uint)!(bool)(bVar77 & 1) * *(int *)(local_8d0.ray + 0xf0);
                            *(uint *)(local_8d0.ray + 0xf4) =
                                 (uint)bVar81 * iVar3 |
                                 (uint)!bVar81 * *(int *)(local_8d0.ray + 0xf4);
                            *(uint *)(local_8d0.ray + 0xf8) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_8d0.ray + 0xf8);
                            *(uint *)(local_8d0.ray + 0xfc) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_8d0.ray + 0xfc);
                            iVar3 = *(int *)(local_8d0.hit + 0x44);
                            iVar4 = *(int *)(local_8d0.hit + 0x48);
                            iVar1 = *(int *)(local_8d0.hit + 0x4c);
                            bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar82 >> 2) & 1);
                            bVar13 = SUB81(uVar82 >> 3,0);
                            *(uint *)(local_8d0.ray + 0x100) =
                                 (uint)(bVar77 & 1) * *(int *)(local_8d0.hit + 0x40) |
                                 (uint)!(bool)(bVar77 & 1) * *(int *)(local_8d0.ray + 0x100);
                            *(uint *)(local_8d0.ray + 0x104) =
                                 (uint)bVar81 * iVar3 |
                                 (uint)!bVar81 * *(int *)(local_8d0.ray + 0x104);
                            *(uint *)(local_8d0.ray + 0x108) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_8d0.ray + 0x108);
                            *(uint *)(local_8d0.ray + 0x10c) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_8d0.ray + 0x10c);
                            auVar86 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_8d0.hit + 0x50));
                            *(undefined1 (*) [16])(local_8d0.ray + 0x110) = auVar86;
                            auVar86 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_8d0.hit + 0x60));
                            *(undefined1 (*) [16])(local_8d0.ray + 0x120) = auVar86;
                            auVar86 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_8d0.hit + 0x70));
                            *(undefined1 (*) [16])(local_8d0.ray + 0x130) = auVar86;
                            auVar86 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_8d0.hit + 0x80));
                            *(undefined1 (*) [16])(local_8d0.ray + 0x140) = auVar86;
                            goto LAB_01e09887;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x80) = fVar232;
                      }
                    }
                  }
                }
LAB_01e09887:
                bVar81 = lVar80 != 0;
                lVar80 = lVar80 + -1;
              } while ((!bVar11) && (bVar81));
              auVar66._4_4_ = fStack_53c;
              auVar66._0_4_ = local_540;
              auVar66._8_4_ = fStack_538;
              auVar66._12_4_ = fStack_534;
              auVar66._16_4_ = fStack_530;
              auVar66._20_4_ = fStack_52c;
              auVar66._24_4_ = fStack_528;
              auVar66._28_4_ = fStack_524;
              uVar145 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar30._4_4_ = uVar145;
              auVar30._0_4_ = uVar145;
              auVar30._8_4_ = uVar145;
              auVar30._12_4_ = uVar145;
              auVar30._16_4_ = uVar145;
              auVar30._20_4_ = uVar145;
              auVar30._24_4_ = uVar145;
              auVar30._28_4_ = uVar145;
              uVar18 = vcmpps_avx512vl(auVar66,auVar30,2);
              bVar75 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar75 & (byte)uVar18;
            } while (bVar75 != 0);
          }
          auVar159._0_4_ = (float)local_560._0_4_ + (float)local_680._0_4_;
          auVar159._4_4_ = (float)local_560._4_4_ + (float)local_680._4_4_;
          auVar159._8_4_ = fStack_558 + fStack_678;
          auVar159._12_4_ = fStack_554 + fStack_674;
          auVar159._16_4_ = fStack_550 + fStack_670;
          auVar159._20_4_ = fStack_54c + fStack_66c;
          auVar159._24_4_ = fStack_548 + fStack_668;
          auVar159._28_4_ = fStack_544 + fStack_664;
          uVar145 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar31._4_4_ = uVar145;
          auVar31._0_4_ = uVar145;
          auVar31._8_4_ = uVar145;
          auVar31._12_4_ = uVar145;
          auVar31._16_4_ = uVar145;
          auVar31._20_4_ = uVar145;
          auVar31._24_4_ = uVar145;
          auVar31._28_4_ = uVar145;
          uVar18 = vcmpps_avx512vl(auVar159,auVar31,2);
          bVar77 = (byte)local_8dc | (byte)local_8e4;
          bVar73 = (byte)uVar19 & bVar73 & (byte)uVar18;
          auVar160._8_4_ = 2;
          auVar160._0_8_ = 0x200000002;
          auVar160._12_4_ = 2;
          auVar160._16_4_ = 2;
          auVar160._20_4_ = 2;
          auVar160._24_4_ = 2;
          auVar160._28_4_ = 2;
          auVar32._8_4_ = 3;
          auVar32._0_8_ = 0x300000003;
          auVar32._12_4_ = 3;
          auVar32._16_4_ = 3;
          auVar32._20_4_ = 3;
          auVar32._24_4_ = 3;
          auVar32._28_4_ = 3;
          auVar96 = vpblendmd_avx512vl(auVar160,auVar32);
          local_560._0_4_ = (uint)(bVar77 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar77 & 1) * 2;
          bVar11 = (bool)(bVar77 >> 1 & 1);
          local_560._4_4_ = (uint)bVar11 * auVar96._4_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar77 >> 2 & 1);
          fStack_558 = (float)((uint)bVar11 * auVar96._8_4_ | (uint)!bVar11 * 2);
          bVar11 = (bool)(bVar77 >> 3 & 1);
          fStack_554 = (float)((uint)bVar11 * auVar96._12_4_ | (uint)!bVar11 * 2);
          bVar11 = (bool)(bVar77 >> 4 & 1);
          fStack_550 = (float)((uint)bVar11 * auVar96._16_4_ | (uint)!bVar11 * 2);
          bVar11 = (bool)(bVar77 >> 5 & 1);
          fStack_54c = (float)((uint)bVar11 * auVar96._20_4_ | (uint)!bVar11 * 2);
          bVar11 = (bool)(bVar77 >> 6 & 1);
          fStack_548 = (float)((uint)bVar11 * auVar96._24_4_ | (uint)!bVar11 * 2);
          fStack_544 = (float)((uint)(bVar77 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar77 >> 7) * 2
                              );
          uVar18 = vpcmpd_avx512vl(_local_560,local_4e0,2);
          bVar77 = (byte)uVar18 & bVar73;
          if (bVar77 != 0) {
            auVar243 = vminps_avx(local_740._0_16_,local_780._0_16_);
            auVar86 = vmaxps_avx(local_740._0_16_,local_780._0_16_);
            auVar87 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar5 = vminps_avx(auVar243,auVar87);
            auVar243 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar87 = vmaxps_avx(auVar86,auVar243);
            auVar86 = vandps_avx(auVar245,auVar5);
            auVar243 = vandps_avx(auVar245,auVar87);
            auVar86 = vmaxps_avx(auVar86,auVar243);
            auVar243 = vmovshdup_avx(auVar86);
            auVar243 = vmaxss_avx(auVar243,auVar86);
            auVar86 = vshufpd_avx(auVar86,auVar86,1);
            auVar86 = vmaxss_avx(auVar86,auVar243);
            fVar143 = auVar86._0_4_ * 1.9073486e-06;
            local_710 = vshufps_avx(auVar87,auVar87,0xff);
            _local_6a0 = _local_480;
            local_540 = (float)local_480._0_4_ + (float)local_680._0_4_;
            fStack_53c = (float)local_480._4_4_ + (float)local_680._4_4_;
            fStack_538 = fStack_478 + fStack_678;
            fStack_534 = fStack_474 + fStack_674;
            fStack_530 = fStack_470 + fStack_670;
            fStack_52c = fStack_46c + fStack_66c;
            fStack_528 = fStack_468 + fStack_668;
            fStack_524 = fStack_464 + fStack_664;
            do {
              auVar161._8_4_ = 0x7f800000;
              auVar161._0_8_ = 0x7f8000007f800000;
              auVar161._12_4_ = 0x7f800000;
              auVar161._16_4_ = 0x7f800000;
              auVar161._20_4_ = 0x7f800000;
              auVar161._24_4_ = 0x7f800000;
              auVar161._28_4_ = 0x7f800000;
              auVar96 = vblendmps_avx512vl(auVar161,_local_6a0);
              auVar132._0_4_ =
                   (uint)(bVar77 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar77 & 1) * 0x7f800000;
              bVar11 = (bool)(bVar77 >> 1 & 1);
              auVar132._4_4_ = (uint)bVar11 * auVar96._4_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar77 >> 2 & 1);
              auVar132._8_4_ = (uint)bVar11 * auVar96._8_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar77 >> 3 & 1);
              auVar132._12_4_ = (uint)bVar11 * auVar96._12_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar77 >> 4 & 1);
              auVar132._16_4_ = (uint)bVar11 * auVar96._16_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar77 >> 5 & 1);
              auVar132._20_4_ = (uint)bVar11 * auVar96._20_4_ | (uint)!bVar11 * 0x7f800000;
              auVar132._24_4_ =
                   (uint)(bVar77 >> 6) * auVar96._24_4_ | (uint)!(bool)(bVar77 >> 6) * 0x7f800000;
              auVar132._28_4_ = 0x7f800000;
              auVar96 = vshufps_avx(auVar132,auVar132,0xb1);
              auVar96 = vminps_avx(auVar132,auVar96);
              auVar94 = vshufpd_avx(auVar96,auVar96,5);
              auVar96 = vminps_avx(auVar96,auVar94);
              auVar94 = vpermpd_avx2(auVar96,0x4e);
              auVar96 = vminps_avx(auVar96,auVar94);
              uVar18 = vcmpps_avx512vl(auVar132,auVar96,0);
              bVar74 = (byte)uVar18 & bVar77;
              bVar75 = bVar77;
              if (bVar74 != 0) {
                bVar75 = bVar74;
              }
              iVar2 = 0;
              for (uVar83 = (uint)bVar75; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
                iVar2 = iVar2 + 1;
              }
              uVar83 = *(uint *)(local_520 + (uint)(iVar2 << 2));
              uVar136 = *(uint *)(local_460 + (uint)(iVar2 << 2));
              fVar230 = local_8d4;
              if ((float)local_7c0._0_4_ < 0.0) {
                fVar230 = sqrtf((float)local_7c0._0_4_);
              }
              auVar244 = ZEXT464(uVar83);
              auVar238 = ZEXT464(uVar136);
              lVar80 = 4;
              do {
                fVar231 = auVar238._0_4_;
                auVar150._4_4_ = fVar231;
                auVar150._0_4_ = fVar231;
                auVar150._8_4_ = fVar231;
                auVar150._12_4_ = fVar231;
                auVar86 = vfmadd132ps_fma(auVar150,ZEXT816(0) << 0x40,local_7b0);
                fVar242 = auVar244._0_4_;
                fVar225 = 1.0 - fVar242;
                fVar240 = fVar225 * fVar225 * fVar225;
                fVar232 = fVar242 * fVar242;
                fVar233 = fVar242 * fVar232;
                auVar243 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar240),
                                           ZEXT416((uint)fVar233));
                fVar239 = fVar242 * fVar225;
                auVar215 = ZEXT416((uint)fVar225);
                auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * fVar239 * 6.0)),
                                         ZEXT416((uint)(fVar239 * fVar225)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar233),
                                          ZEXT416((uint)fVar240));
                auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar239 * fVar225 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar242 * fVar239)));
                fVar240 = fVar240 * 0.16666667;
                fVar241 = (auVar243._0_4_ + auVar5._0_4_) * 0.16666667;
                fVar205 = (auVar87._0_4_ + auVar84._0_4_) * 0.16666667;
                fVar233 = fVar233 * 0.16666667;
                auVar194._0_4_ = fVar233 * (float)local_7a0._0_4_;
                auVar194._4_4_ = fVar233 * (float)local_7a0._4_4_;
                auVar194._8_4_ = fVar233 * fStack_798;
                auVar194._12_4_ = fVar233 * fStack_794;
                auVar218._4_4_ = fVar205;
                auVar218._0_4_ = fVar205;
                auVar218._8_4_ = fVar205;
                auVar218._12_4_ = fVar205;
                auVar243 = vfmadd132ps_fma(auVar218,auVar194,local_760._0_16_);
                auVar195._4_4_ = fVar241;
                auVar195._0_4_ = fVar241;
                auVar195._8_4_ = fVar241;
                auVar195._12_4_ = fVar241;
                auVar243 = vfmadd132ps_fma(auVar195,auVar243,local_780._0_16_);
                auVar176._4_4_ = fVar240;
                auVar176._0_4_ = fVar240;
                auVar176._8_4_ = fVar240;
                auVar176._12_4_ = fVar240;
                auVar243 = vfmadd132ps_fma(auVar176,auVar243,local_740._0_16_);
                local_660._0_16_ = auVar243;
                auVar86 = vsubps_avx(auVar86,auVar243);
                local_7e0._0_16_ = auVar86;
                auVar86 = vdpps_avx(auVar86,auVar86,0x7f);
                auVar243 = auVar244._0_16_;
                local_800._0_16_ = auVar86;
                if (auVar86._0_4_ < 0.0) {
                  local_8a0._0_4_ = fVar232;
                  auVar226._0_4_ = sqrtf(auVar86._0_4_);
                  auVar226._4_60_ = extraout_var_01;
                  auVar86 = auVar226._0_16_;
                }
                else {
                  auVar86 = vsqrtss_avx(auVar86,auVar86);
                  local_8a0._0_4_ = fVar232;
                }
                auVar5 = vfnmsub213ss_fma(auVar243,auVar243,ZEXT416((uint)(fVar239 * 4.0)));
                auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar239 * 4.0)),auVar215,auVar215);
                fVar232 = fVar225 * -fVar225 * 0.5;
                fVar239 = auVar5._0_4_ * 0.5;
                fVar240 = auVar87._0_4_ * 0.5;
                local_8a0._0_4_ = (float)local_8a0._0_4_ * 0.5;
                auVar209._0_4_ = (float)local_8a0._0_4_ * (float)local_7a0._0_4_;
                auVar209._4_4_ = (float)local_8a0._0_4_ * (float)local_7a0._4_4_;
                auVar209._8_4_ = (float)local_8a0._0_4_ * fStack_798;
                auVar209._12_4_ = (float)local_8a0._0_4_ * fStack_794;
                auVar177._4_4_ = fVar240;
                auVar177._0_4_ = fVar240;
                auVar177._8_4_ = fVar240;
                auVar177._12_4_ = fVar240;
                auVar87 = vfmadd132ps_fma(auVar177,auVar209,local_760._0_16_);
                auVar196._4_4_ = fVar239;
                auVar196._0_4_ = fVar239;
                auVar196._8_4_ = fVar239;
                auVar196._12_4_ = fVar239;
                auVar87 = vfmadd132ps_fma(auVar196,auVar87,local_780._0_16_);
                auVar251._4_4_ = fVar232;
                auVar251._0_4_ = fVar232;
                auVar251._8_4_ = fVar232;
                auVar251._12_4_ = fVar232;
                local_8a0._0_16_ = vfmadd132ps_fma(auVar251,auVar87,local_740._0_16_);
                local_6c0 = vdpps_avx(local_8a0._0_16_,local_8a0._0_16_,0x7f);
                auVar59._12_4_ = 0;
                auVar59._0_12_ = ZEXT812(0);
                fVar232 = local_6c0._0_4_;
                auVar87 = vrsqrt14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar232));
                fVar239 = auVar87._0_4_;
                local_6d0 = vrcp14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar232));
                auVar87 = vfnmadd213ss_fma(local_6d0,local_6c0,ZEXT416(0x40000000));
                uVar83 = auVar86._0_4_;
                local_6b0 = fVar225;
                fStack_6ac = fVar225;
                fStack_6a8 = fVar225;
                fStack_6a4 = fVar225;
                if (fVar232 < -fVar232) {
                  auVar237._0_4_ = sqrtf(fVar232);
                  auVar237._4_60_ = extraout_var_02;
                  auVar86 = ZEXT416(uVar83);
                  auVar84 = auVar237._0_16_;
                  auVar5 = local_8a0._0_16_;
                }
                else {
                  auVar84 = vsqrtss_avx512f(local_6c0,local_6c0);
                  auVar5 = local_8a0._0_16_;
                }
                fVar232 = fVar239 * 1.5 + fVar232 * -0.5 * fVar239 * fVar239 * fVar239;
                auVar151._0_4_ = auVar5._0_4_ * fVar232;
                auVar151._4_4_ = auVar5._4_4_ * fVar232;
                auVar151._8_4_ = auVar5._8_4_ * fVar232;
                auVar151._12_4_ = auVar5._12_4_ * fVar232;
                auVar6 = vdpps_avx(local_7e0._0_16_,auVar151,0x7f);
                fVar241 = auVar86._0_4_;
                fVar239 = auVar6._0_4_;
                auVar152._0_4_ = fVar239 * fVar239;
                auVar152._4_4_ = auVar6._4_4_ * auVar6._4_4_;
                auVar152._8_4_ = auVar6._8_4_ * auVar6._8_4_;
                auVar152._12_4_ = auVar6._12_4_ * auVar6._12_4_;
                auVar88 = vsubps_avx512vl(local_800._0_16_,auVar152);
                fVar240 = auVar88._0_4_;
                auVar178._4_12_ = ZEXT812(0) << 0x20;
                auVar178._0_4_ = fVar240;
                auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
                auVar89 = vmulss_avx512f(auVar85,ZEXT416(0x3fc00000));
                auVar90 = vmulss_avx512f(auVar88,ZEXT416(0xbf000000));
                if (fVar240 < 0.0) {
                  local_6f0 = fVar232;
                  fStack_6ec = fVar232;
                  fStack_6e8 = fVar232;
                  fStack_6e4 = fVar232;
                  local_6e0 = auVar85;
                  fVar240 = sqrtf(fVar240);
                  auVar90 = ZEXT416(auVar90._0_4_);
                  auVar89 = ZEXT416(auVar89._0_4_);
                  auVar84 = ZEXT416(auVar84._0_4_);
                  auVar86 = ZEXT416(uVar83);
                  auVar5 = local_8a0._0_16_;
                  auVar85 = local_6e0;
                  fVar232 = local_6f0;
                  fVar205 = fStack_6ec;
                  fVar233 = fStack_6e8;
                  fVar225 = fStack_6e4;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar88,auVar88);
                  fVar240 = auVar88._0_4_;
                  fVar205 = fVar232;
                  fVar233 = fVar232;
                  fVar225 = fVar232;
                }
                auVar253 = ZEXT1664(auVar5);
                auVar236._8_4_ = 0x7fffffff;
                auVar236._0_8_ = 0x7fffffff7fffffff;
                auVar236._12_4_ = 0x7fffffff;
                auVar237 = ZEXT1664(auVar236);
                auVar256 = ZEXT3264(local_820);
                auVar255 = ZEXT3264(local_840);
                auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar215,auVar243);
                auVar243 = vfmadd231ss_fma(auVar215,auVar243,SUB6416(ZEXT464(0xc0000000),0));
                auVar197._0_4_ = fVar242 * (float)local_7a0._0_4_;
                auVar197._4_4_ = fVar242 * (float)local_7a0._4_4_;
                auVar197._8_4_ = fVar242 * fStack_798;
                auVar197._12_4_ = fVar242 * fStack_794;
                auVar210._0_4_ = auVar243._0_4_;
                auVar210._4_4_ = auVar210._0_4_;
                auVar210._8_4_ = auVar210._0_4_;
                auVar210._12_4_ = auVar210._0_4_;
                auVar243 = vfmadd132ps_fma(auVar210,auVar197,local_760._0_16_);
                auVar179._0_4_ = auVar88._0_4_;
                auVar179._4_4_ = auVar179._0_4_;
                auVar179._8_4_ = auVar179._0_4_;
                auVar179._12_4_ = auVar179._0_4_;
                auVar243 = vfmadd132ps_fma(auVar179,auVar243,local_780._0_16_);
                auVar65._4_4_ = fStack_6ac;
                auVar65._0_4_ = local_6b0;
                auVar65._8_4_ = fStack_6a8;
                auVar65._12_4_ = fStack_6a4;
                auVar243 = vfmadd132ps_fma(auVar65,auVar243,local_740._0_16_);
                auVar180._0_4_ = auVar243._0_4_ * (float)local_6c0._0_4_;
                auVar180._4_4_ = auVar243._4_4_ * (float)local_6c0._0_4_;
                auVar180._8_4_ = auVar243._8_4_ * (float)local_6c0._0_4_;
                auVar180._12_4_ = auVar243._12_4_ * (float)local_6c0._0_4_;
                auVar243 = vdpps_avx(auVar5,auVar243,0x7f);
                fVar188 = auVar243._0_4_;
                auVar198._0_4_ = auVar5._0_4_ * fVar188;
                auVar198._4_4_ = auVar5._4_4_ * fVar188;
                auVar198._8_4_ = auVar5._8_4_ * fVar188;
                auVar198._12_4_ = auVar5._12_4_ * fVar188;
                auVar243 = vsubps_avx(auVar180,auVar198);
                fVar188 = auVar87._0_4_ * (float)local_6d0._0_4_;
                auVar22._8_4_ = 0x80000000;
                auVar22._0_8_ = 0x8000000080000000;
                auVar22._12_4_ = 0x80000000;
                auVar134._16_16_ = local_840._16_16_;
                auVar88 = vxorps_avx512vl(auVar5,auVar22);
                auVar219._0_4_ = fVar232 * auVar243._0_4_ * fVar188;
                auVar219._4_4_ = fVar205 * auVar243._4_4_ * fVar188;
                auVar219._8_4_ = fVar233 * auVar243._8_4_ * fVar188;
                auVar219._12_4_ = fVar225 * auVar243._12_4_ * fVar188;
                auVar249 = ZEXT1664(auVar151);
                auVar243 = vdpps_avx(auVar88,auVar151,0x7f);
                auVar215 = vmaxss_avx(ZEXT416((uint)fVar143),
                                      ZEXT416((uint)(fVar231 * fVar230 * 1.9073486e-06)));
                auVar84 = vdivss_avx512f(ZEXT416((uint)fVar143),auVar84);
                auVar87 = vdpps_avx(local_7e0._0_16_,auVar219,0x7f);
                auVar86 = vfmadd213ss_fma(auVar86,ZEXT416((uint)fVar143),auVar215);
                auVar84 = vfmadd213ss_fma(ZEXT416((uint)(fVar241 + 1.0)),auVar84,auVar86);
                auVar86 = vdpps_avx(local_7b0,auVar151,0x7f);
                fVar232 = auVar243._0_4_ + auVar87._0_4_;
                auVar243 = vdpps_avx(local_7e0._0_16_,auVar88,0x7f);
                auVar88 = vmulss_avx512f(auVar90,auVar85);
                auVar85 = vmulss_avx512f(auVar85,auVar85);
                auVar87 = vdpps_avx(local_7e0._0_16_,local_7b0,0x7f);
                auVar89 = vaddss_avx512f(auVar89,ZEXT416((uint)(auVar88._0_4_ * auVar85._0_4_)));
                auVar85 = vfnmadd231ss_fma(auVar243,auVar6,ZEXT416((uint)fVar232));
                auVar88 = vfnmadd231ss_fma(auVar87,auVar6,auVar86);
                auVar243 = vpermilps_avx(local_660._0_16_,0xff);
                fVar240 = fVar240 - auVar243._0_4_;
                auVar243 = vshufps_avx(auVar5,auVar5,0xff);
                auVar87 = vfmsub213ss_fma(auVar85,auVar89,auVar243);
                fVar241 = auVar88._0_4_ * auVar89._0_4_;
                auVar85 = vfmsub231ss_fma(ZEXT416((uint)(auVar86._0_4_ * auVar87._0_4_)),
                                          ZEXT416((uint)fVar232),ZEXT416((uint)fVar241));
                fVar233 = auVar85._0_4_;
                fVar205 = fVar239 * (auVar87._0_4_ / fVar233);
                auVar226 = ZEXT464((uint)fVar205);
                fVar242 = fVar242 - (fVar239 * (fVar241 / fVar233) -
                                    fVar240 * (auVar86._0_4_ / fVar233));
                auVar244 = ZEXT464((uint)fVar242);
                fVar231 = fVar231 - (fVar240 * (fVar232 / fVar233) - fVar205);
                auVar238 = ZEXT464((uint)fVar231);
                auVar86 = vandps_avx(auVar6,auVar236);
                if (auVar84._0_4_ <= auVar86._0_4_) {
LAB_01e0a45e:
                  bVar11 = false;
                }
                else {
                  auVar87 = vfmadd231ss_fma(ZEXT416((uint)(auVar84._0_4_ + auVar215._0_4_)),
                                            local_710,ZEXT416(0x36000000));
                  auVar86 = vandps_avx(auVar236,ZEXT416((uint)fVar240));
                  if (auVar87._0_4_ <= auVar86._0_4_) goto LAB_01e0a45e;
                  fVar231 = fVar231 + (float)local_700._0_4_;
                  auVar238 = ZEXT464((uint)fVar231);
                  bVar11 = true;
                  if ((((fVar206 <= fVar231) &&
                       (fVar232 = *(float *)(ray + k * 4 + 0x80), fVar231 <= fVar232)) &&
                      (0.0 <= fVar242)) && (fVar242 <= 1.0)) {
                    auVar134._0_16_ = ZEXT816(0) << 0x20;
                    auVar133._4_28_ = auVar134._4_28_;
                    auVar133._0_4_ = local_800._0_4_;
                    auVar86 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar133._0_16_);
                    fVar239 = auVar86._0_4_;
                    auVar86 = vmulss_avx512f(local_800._0_16_,ZEXT416(0xbf000000));
                    pGVar9 = (context->scene->geometries).items[uVar79].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar239 = fVar239 * 1.5 + auVar86._0_4_ * fVar239 * fVar239 * fVar239;
                      auVar181._0_4_ = local_7e0._0_4_ * fVar239;
                      auVar181._4_4_ = local_7e0._4_4_ * fVar239;
                      auVar181._8_4_ = local_7e0._8_4_ * fVar239;
                      auVar181._12_4_ = local_7e0._12_4_ * fVar239;
                      auVar84 = vfmadd213ps_fma(auVar243,auVar181,auVar5);
                      auVar86 = vshufps_avx(auVar181,auVar181,0xc9);
                      auVar243 = vshufps_avx(auVar5,auVar5,0xc9);
                      auVar182._0_4_ = auVar181._0_4_ * auVar243._0_4_;
                      auVar182._4_4_ = auVar181._4_4_ * auVar243._4_4_;
                      auVar182._8_4_ = auVar181._8_4_ * auVar243._8_4_;
                      auVar182._12_4_ = auVar181._12_4_ * auVar243._12_4_;
                      auVar87 = vfmsub231ps_fma(auVar182,auVar5,auVar86);
                      auVar86 = vshufps_avx(auVar87,auVar87,0xc9);
                      auVar243 = vshufps_avx(auVar84,auVar84,0xc9);
                      auVar87 = vshufps_avx(auVar87,auVar87,0xd2);
                      auVar153._0_4_ = auVar84._0_4_ * auVar87._0_4_;
                      auVar153._4_4_ = auVar84._4_4_ * auVar87._4_4_;
                      auVar153._8_4_ = auVar84._8_4_ * auVar87._8_4_;
                      auVar153._12_4_ = auVar84._12_4_ * auVar87._12_4_;
                      auVar86 = vfmsub231ps_fma(auVar153,auVar86,auVar243);
                      uVar145 = auVar86._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar231;
                        uVar8 = vextractps_avx(auVar86,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                        uVar8 = vextractps_avx(auVar86,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar145;
                        *(float *)(ray + k * 4 + 0xf0) = fVar242;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_8f0;
                        *(uint *)(ray + k * 4 + 0x120) = uVar79;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_600 = (RTCHitN  [16])vshufps_avx(auVar86,auVar86,0x55);
                        auStack_5f0 = vshufps_avx(auVar86,auVar86,0xaa);
                        local_5e0 = uVar145;
                        uStack_5dc = uVar145;
                        uStack_5d8 = uVar145;
                        uStack_5d4 = uVar145;
                        local_5d0 = fVar242;
                        fStack_5cc = fVar242;
                        fStack_5c8 = fVar242;
                        fStack_5c4 = fVar242;
                        local_5c0 = ZEXT416(0) << 0x20;
                        local_5b0 = local_620._0_8_;
                        uStack_5a8 = local_620._8_8_;
                        local_5a0 = local_610;
                        vpcmpeqd_avx2(ZEXT1632(local_610),ZEXT1632(local_610));
                        uStack_58c = context->user->instID[0];
                        local_590 = uStack_58c;
                        uStack_588 = uStack_58c;
                        uStack_584 = uStack_58c;
                        uStack_580 = context->user->instPrimID[0];
                        uStack_57c = uStack_580;
                        uStack_578 = uStack_580;
                        uStack_574 = uStack_580;
                        *(float *)(ray + k * 4 + 0x80) = fVar231;
                        local_900 = local_630._0_8_;
                        uStack_8f8 = local_630._8_8_;
                        local_8d0.valid = (int *)&local_900;
                        local_8d0.geometryUserPtr = pGVar9->userPtr;
                        local_8d0.context = context->user;
                        local_8d0.hit = local_600;
                        local_8d0.N = 4;
                        local_8d0.ray = (RTCRayN *)ray;
                        if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar226 = ZEXT464((uint)fVar205);
                          auVar237 = ZEXT1664(auVar236);
                          auVar249 = ZEXT1664(auVar151);
                          auVar253 = ZEXT1664(auVar5);
                          (*pGVar9->intersectionFilterN)(&local_8d0);
                          auVar238 = ZEXT1664(ZEXT416((uint)fVar231));
                          auVar244 = ZEXT1664(ZEXT416((uint)fVar242));
                          auVar255 = ZEXT3264(local_840);
                          auVar256 = ZEXT3264(local_820);
                        }
                        auVar62._8_8_ = uStack_8f8;
                        auVar62._0_8_ = local_900;
                        uVar82 = vptestmd_avx512vl(auVar62,auVar62);
                        if ((uVar82 & 0xf) != 0) {
                          p_Var10 = context->args->filter;
                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar226 = ZEXT1664(auVar226._0_16_);
                            auVar237 = ZEXT1664(auVar237._0_16_);
                            auVar249 = ZEXT1664(auVar249._0_16_);
                            auVar253 = ZEXT1664(auVar253._0_16_);
                            (*p_Var10)(&local_8d0);
                            auVar238 = ZEXT1664(ZEXT416((uint)fVar231));
                            auVar244 = ZEXT1664(ZEXT416((uint)fVar242));
                            auVar255 = ZEXT3264(local_840);
                            auVar256 = ZEXT3264(local_820);
                          }
                          auVar63._8_8_ = uStack_8f8;
                          auVar63._0_8_ = local_900;
                          uVar82 = vptestmd_avx512vl(auVar63,auVar63);
                          uVar82 = uVar82 & 0xf;
                          bVar75 = (byte)uVar82;
                          if (bVar75 != 0) {
                            iVar3 = *(int *)(local_8d0.hit + 4);
                            iVar4 = *(int *)(local_8d0.hit + 8);
                            iVar1 = *(int *)(local_8d0.hit + 0xc);
                            bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar82 >> 2) & 1);
                            bVar13 = SUB81(uVar82 >> 3,0);
                            *(uint *)(local_8d0.ray + 0xc0) =
                                 (uint)(bVar75 & 1) * *(int *)local_8d0.hit |
                                 (uint)!(bool)(bVar75 & 1) * *(int *)(local_8d0.ray + 0xc0);
                            *(uint *)(local_8d0.ray + 0xc4) =
                                 (uint)bVar81 * iVar3 |
                                 (uint)!bVar81 * *(int *)(local_8d0.ray + 0xc4);
                            *(uint *)(local_8d0.ray + 200) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_8d0.ray + 200);
                            *(uint *)(local_8d0.ray + 0xcc) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_8d0.ray + 0xcc);
                            iVar3 = *(int *)(local_8d0.hit + 0x14);
                            iVar4 = *(int *)(local_8d0.hit + 0x18);
                            iVar1 = *(int *)(local_8d0.hit + 0x1c);
                            bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar82 >> 2) & 1);
                            bVar13 = SUB81(uVar82 >> 3,0);
                            *(uint *)(local_8d0.ray + 0xd0) =
                                 (uint)(bVar75 & 1) * *(int *)(local_8d0.hit + 0x10) |
                                 (uint)!(bool)(bVar75 & 1) * *(int *)(local_8d0.ray + 0xd0);
                            *(uint *)(local_8d0.ray + 0xd4) =
                                 (uint)bVar81 * iVar3 |
                                 (uint)!bVar81 * *(int *)(local_8d0.ray + 0xd4);
                            *(uint *)(local_8d0.ray + 0xd8) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_8d0.ray + 0xd8);
                            *(uint *)(local_8d0.ray + 0xdc) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_8d0.ray + 0xdc);
                            iVar3 = *(int *)(local_8d0.hit + 0x24);
                            iVar4 = *(int *)(local_8d0.hit + 0x28);
                            iVar1 = *(int *)(local_8d0.hit + 0x2c);
                            bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar82 >> 2) & 1);
                            bVar13 = SUB81(uVar82 >> 3,0);
                            *(uint *)(local_8d0.ray + 0xe0) =
                                 (uint)(bVar75 & 1) * *(int *)(local_8d0.hit + 0x20) |
                                 (uint)!(bool)(bVar75 & 1) * *(int *)(local_8d0.ray + 0xe0);
                            *(uint *)(local_8d0.ray + 0xe4) =
                                 (uint)bVar81 * iVar3 |
                                 (uint)!bVar81 * *(int *)(local_8d0.ray + 0xe4);
                            *(uint *)(local_8d0.ray + 0xe8) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_8d0.ray + 0xe8);
                            *(uint *)(local_8d0.ray + 0xec) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_8d0.ray + 0xec);
                            iVar3 = *(int *)(local_8d0.hit + 0x34);
                            iVar4 = *(int *)(local_8d0.hit + 0x38);
                            iVar1 = *(int *)(local_8d0.hit + 0x3c);
                            bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar82 >> 2) & 1);
                            bVar13 = SUB81(uVar82 >> 3,0);
                            *(uint *)(local_8d0.ray + 0xf0) =
                                 (uint)(bVar75 & 1) * *(int *)(local_8d0.hit + 0x30) |
                                 (uint)!(bool)(bVar75 & 1) * *(int *)(local_8d0.ray + 0xf0);
                            *(uint *)(local_8d0.ray + 0xf4) =
                                 (uint)bVar81 * iVar3 |
                                 (uint)!bVar81 * *(int *)(local_8d0.ray + 0xf4);
                            *(uint *)(local_8d0.ray + 0xf8) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_8d0.ray + 0xf8);
                            *(uint *)(local_8d0.ray + 0xfc) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_8d0.ray + 0xfc);
                            iVar3 = *(int *)(local_8d0.hit + 0x44);
                            iVar4 = *(int *)(local_8d0.hit + 0x48);
                            iVar1 = *(int *)(local_8d0.hit + 0x4c);
                            bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar82 >> 2) & 1);
                            bVar13 = SUB81(uVar82 >> 3,0);
                            *(uint *)(local_8d0.ray + 0x100) =
                                 (uint)(bVar75 & 1) * *(int *)(local_8d0.hit + 0x40) |
                                 (uint)!(bool)(bVar75 & 1) * *(int *)(local_8d0.ray + 0x100);
                            *(uint *)(local_8d0.ray + 0x104) =
                                 (uint)bVar81 * iVar3 |
                                 (uint)!bVar81 * *(int *)(local_8d0.ray + 0x104);
                            *(uint *)(local_8d0.ray + 0x108) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_8d0.ray + 0x108);
                            *(uint *)(local_8d0.ray + 0x10c) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_8d0.ray + 0x10c);
                            auVar86 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_8d0.hit + 0x50));
                            *(undefined1 (*) [16])(local_8d0.ray + 0x110) = auVar86;
                            auVar86 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_8d0.hit + 0x60));
                            *(undefined1 (*) [16])(local_8d0.ray + 0x120) = auVar86;
                            auVar86 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_8d0.hit + 0x70));
                            *(undefined1 (*) [16])(local_8d0.ray + 0x130) = auVar86;
                            auVar86 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_8d0.hit + 0x80));
                            *(undefined1 (*) [16])(local_8d0.ray + 0x140) = auVar86;
                            goto LAB_01e0a461;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x80) = fVar232;
                      }
                    }
                  }
                }
LAB_01e0a461:
                bVar81 = lVar80 != 0;
                lVar80 = lVar80 + -1;
              } while ((!bVar11) && (bVar81));
              auVar67._4_4_ = fStack_53c;
              auVar67._0_4_ = local_540;
              auVar67._8_4_ = fStack_538;
              auVar67._12_4_ = fStack_534;
              auVar67._16_4_ = fStack_530;
              auVar67._20_4_ = fStack_52c;
              auVar67._24_4_ = fStack_528;
              auVar67._28_4_ = fStack_524;
              uVar145 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar33._4_4_ = uVar145;
              auVar33._0_4_ = uVar145;
              auVar33._8_4_ = uVar145;
              auVar33._12_4_ = uVar145;
              auVar33._16_4_ = uVar145;
              auVar33._20_4_ = uVar145;
              auVar33._24_4_ = uVar145;
              auVar33._28_4_ = uVar145;
              uVar18 = vcmpps_avx512vl(auVar67,auVar33,2);
              bVar77 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar77 & (byte)uVar18;
            } while (bVar77 != 0);
          }
          uVar19 = vpcmpd_avx512vl(local_4e0,_local_560,1);
          uVar20 = vpcmpd_avx512vl(local_4e0,local_440,1);
          auVar183._0_4_ = (float)local_680._0_4_ + (float)local_1c0._0_4_;
          auVar183._4_4_ = (float)local_680._4_4_ + (float)local_1c0._4_4_;
          auVar183._8_4_ = fStack_678 + fStack_1b8;
          auVar183._12_4_ = fStack_674 + fStack_1b4;
          auVar183._16_4_ = fStack_670 + fStack_1b0;
          auVar183._20_4_ = fStack_66c + fStack_1ac;
          auVar183._24_4_ = fStack_668 + fStack_1a8;
          auVar183._28_4_ = fStack_664 + fStack_1a4;
          uVar145 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar200._4_4_ = uVar145;
          auVar200._0_4_ = uVar145;
          auVar200._8_4_ = uVar145;
          auVar200._12_4_ = uVar145;
          auVar200._16_4_ = uVar145;
          auVar200._20_4_ = uVar145;
          auVar200._24_4_ = uVar145;
          auVar200._28_4_ = uVar145;
          uVar18 = vcmpps_avx512vl(auVar183,auVar200,2);
          bVar77 = (byte)local_8e0 & (byte)uVar20 & (byte)uVar18;
          auVar214._0_4_ = (float)local_680._0_4_ + (float)local_480._0_4_;
          auVar214._4_4_ = (float)local_680._4_4_ + (float)local_480._4_4_;
          auVar214._8_4_ = fStack_678 + fStack_478;
          auVar214._12_4_ = fStack_674 + fStack_474;
          auVar214._16_4_ = fStack_670 + fStack_470;
          auVar214._20_4_ = fStack_66c + fStack_46c;
          auVar214._24_4_ = fStack_668 + fStack_468;
          auVar214._28_4_ = fStack_664 + fStack_464;
          uVar18 = vcmpps_avx512vl(auVar214,auVar200,2);
          bVar73 = bVar73 & (byte)uVar19 & (byte)uVar18 | bVar77;
          prim = local_860;
          if (bVar73 == 0) {
            auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar254 = ZEXT3264(auVar96);
          }
          else {
            uVar82 = local_850 & 0xffffffff;
            abStack_180[uVar82 * 0x60] = bVar73;
            bVar11 = (bool)(bVar77 >> 1 & 1);
            bVar81 = (bool)(bVar77 >> 2 & 1);
            bVar12 = (bool)(bVar77 >> 3 & 1);
            bVar13 = (bool)(bVar77 >> 4 & 1);
            bVar14 = (bool)(bVar77 >> 5 & 1);
            bVar15 = (bool)(bVar77 >> 6 & 1);
            auStack_160[uVar82 * 0x18] =
                 (uint)(bVar77 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar77 & 1) * local_480._0_4_;
            auStack_160[uVar82 * 0x18 + 1] =
                 (uint)bVar11 * local_1c0._4_4_ | (uint)!bVar11 * local_480._4_4_;
            auStack_160[uVar82 * 0x18 + 2] =
                 (uint)bVar81 * (int)fStack_1b8 | (uint)!bVar81 * (int)fStack_478;
            auStack_160[uVar82 * 0x18 + 3] =
                 (uint)bVar12 * (int)fStack_1b4 | (uint)!bVar12 * (int)fStack_474;
            auStack_160[uVar82 * 0x18 + 4] =
                 (uint)bVar13 * (int)fStack_1b0 | (uint)!bVar13 * (int)fStack_470;
            afStack_140[uVar82 * 0x18 + -3] =
                 (float)((uint)bVar14 * (int)fStack_1ac | (uint)!bVar14 * (int)fStack_46c);
            afStack_140[uVar82 * 0x18 + -2] =
                 (float)((uint)bVar15 * (int)fStack_1a8 | (uint)!bVar15 * (int)fStack_468);
            afStack_140[uVar82 * 0x18 + -1] =
                 (float)((uint)(bVar77 >> 7) * (int)fStack_1a4 |
                        (uint)!(bool)(bVar77 >> 7) * (int)fStack_464);
            uVar18 = vmovlps_avx(local_870);
            *(undefined8 *)(afStack_140 + uVar82 * 0x18) = uVar18;
            auStack_138[uVar82 * 0x18] = (int)local_858 + 1;
            local_850 = (ulong)((int)local_850 + 1);
            auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar254 = ZEXT3264(auVar96);
          }
        }
      }
    }
    auVar201 = ZEXT1664(local_870);
    local_850 = local_850 & 0xffffffff;
    do {
      if ((int)local_850 == 0) {
        uVar145 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar35._4_4_ = uVar145;
        auVar35._0_4_ = uVar145;
        auVar35._8_4_ = uVar145;
        auVar35._12_4_ = uVar145;
        auVar35._16_4_ = uVar145;
        auVar35._20_4_ = uVar145;
        auVar35._24_4_ = uVar145;
        auVar35._28_4_ = uVar145;
        uVar18 = vcmpps_avx512vl(local_420,auVar35,2);
        uVar79 = (uint)local_848 & (uint)uVar18;
        local_848 = (ulong)uVar79;
        if (uVar79 == 0) {
          return;
        }
        goto LAB_01e080f7;
      }
      uVar82 = (ulong)((int)local_850 - 1);
      auVar96 = *(undefined1 (*) [32])(auStack_160 + uVar82 * 0x18);
      auVar184._0_4_ = auVar96._0_4_ + (float)local_680._0_4_;
      auVar184._4_4_ = auVar96._4_4_ + (float)local_680._4_4_;
      auVar184._8_4_ = auVar96._8_4_ + fStack_678;
      auVar184._12_4_ = auVar96._12_4_ + fStack_674;
      auVar184._16_4_ = auVar96._16_4_ + fStack_670;
      auVar184._20_4_ = auVar96._20_4_ + fStack_66c;
      auVar184._24_4_ = auVar96._24_4_ + fStack_668;
      auVar184._28_4_ = auVar96._28_4_ + fStack_664;
      uVar145 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar34._4_4_ = uVar145;
      auVar34._0_4_ = uVar145;
      auVar34._8_4_ = uVar145;
      auVar34._12_4_ = uVar145;
      auVar34._16_4_ = uVar145;
      auVar34._20_4_ = uVar145;
      auVar34._24_4_ = uVar145;
      auVar34._28_4_ = uVar145;
      uVar18 = vcmpps_avx512vl(auVar184,auVar34,2);
      uVar83 = (uint)uVar18 & (uint)abStack_180[uVar82 * 0x60];
      bVar73 = (byte)uVar83;
      if (uVar83 != 0) {
        auVar185._8_4_ = 0x7f800000;
        auVar185._0_8_ = 0x7f8000007f800000;
        auVar185._12_4_ = 0x7f800000;
        auVar185._16_4_ = 0x7f800000;
        auVar185._20_4_ = 0x7f800000;
        auVar185._24_4_ = 0x7f800000;
        auVar185._28_4_ = 0x7f800000;
        auVar94 = vblendmps_avx512vl(auVar185,auVar96);
        auVar135._0_4_ =
             (uint)(bVar73 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar73 & 1) * (int)auVar96._0_4_;
        bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar135._4_4_ = (uint)bVar11 * auVar94._4_4_ | (uint)!bVar11 * (int)auVar96._4_4_;
        bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar135._8_4_ = (uint)bVar11 * auVar94._8_4_ | (uint)!bVar11 * (int)auVar96._8_4_;
        bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar135._12_4_ = (uint)bVar11 * auVar94._12_4_ | (uint)!bVar11 * (int)auVar96._12_4_;
        bVar11 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar135._16_4_ = (uint)bVar11 * auVar94._16_4_ | (uint)!bVar11 * (int)auVar96._16_4_;
        bVar11 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar135._20_4_ = (uint)bVar11 * auVar94._20_4_ | (uint)!bVar11 * (int)auVar96._20_4_;
        bVar11 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar135._24_4_ = (uint)bVar11 * auVar94._24_4_ | (uint)!bVar11 * (int)auVar96._24_4_;
        auVar135._28_4_ =
             (uVar83 >> 7) * auVar94._28_4_ | (uint)!SUB41(uVar83 >> 7,0) * (int)auVar96._28_4_;
        auVar96 = vshufps_avx(auVar135,auVar135,0xb1);
        auVar96 = vminps_avx(auVar135,auVar96);
        auVar94 = vshufpd_avx(auVar96,auVar96,5);
        auVar96 = vminps_avx(auVar96,auVar94);
        auVar94 = vpermpd_avx2(auVar96,0x4e);
        auVar96 = vminps_avx(auVar96,auVar94);
        uVar18 = vcmpps_avx512vl(auVar135,auVar96,0);
        bVar77 = (byte)uVar18 & bVar73;
        if (bVar77 != 0) {
          uVar83 = (uint)bVar77;
        }
        fVar143 = afStack_140[uVar82 * 0x18 + 1];
        uVar136 = 0;
        for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
          uVar136 = uVar136 + 1;
        }
        local_858 = (ulong)auStack_138[uVar82 * 0x18];
        bVar77 = ~('\x01' << ((byte)uVar136 & 0x1f)) & bVar73;
        abStack_180[uVar82 * 0x60] = bVar77;
        uVar78 = uVar82;
        if (bVar77 != 0) {
          uVar78 = local_850;
        }
        fVar230 = afStack_140[uVar82 * 0x18];
        auVar186._4_4_ = fVar230;
        auVar186._0_4_ = fVar230;
        auVar186._8_4_ = fVar230;
        auVar186._12_4_ = fVar230;
        auVar186._16_4_ = fVar230;
        auVar186._20_4_ = fVar230;
        auVar186._24_4_ = fVar230;
        auVar186._28_4_ = fVar230;
        fVar143 = fVar143 - fVar230;
        auVar162._4_4_ = fVar143;
        auVar162._0_4_ = fVar143;
        auVar162._8_4_ = fVar143;
        auVar162._12_4_ = fVar143;
        auVar162._16_4_ = fVar143;
        auVar162._20_4_ = fVar143;
        auVar162._24_4_ = fVar143;
        auVar162._28_4_ = fVar143;
        auVar86 = vfmadd132ps_fma(auVar162,auVar186,_DAT_02020f20);
        _local_600 = ZEXT1632(auVar86);
        auVar201 = ZEXT864(*(ulong *)(local_600 + (ulong)uVar136 * 4));
        uVar82 = uVar78;
      }
      local_850 = uVar82;
    } while (bVar73 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }